

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersectorK<4,8>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float fVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  undefined4 uVar5;
  Geometry *pGVar6;
  __int_type_conflict _Var7;
  long lVar8;
  long lVar9;
  RTCRayQueryContext *pRVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  float fVar19;
  float fVar20;
  undefined8 uVar21;
  ulong uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  int iVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [12];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  byte bVar60;
  byte bVar61;
  byte bVar62;
  byte bVar63;
  ulong uVar64;
  byte bVar65;
  byte bVar66;
  long lVar67;
  long lVar68;
  bool bVar69;
  ulong uVar70;
  uint uVar71;
  uint uVar148;
  uint uVar149;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  uint uVar151;
  uint uVar152;
  uint uVar153;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  uint uVar150;
  uint uVar154;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  float fVar155;
  float fVar173;
  float fVar174;
  vint4 bi_2;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar164 [32];
  float fVar175;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar179;
  vint4 bi_1;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar192 [16];
  undefined1 auVar196 [32];
  float fVar197;
  float fVar198;
  float fVar214;
  float fVar215;
  vint4 bi;
  undefined1 auVar199 [16];
  float fVar216;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar236;
  float fVar237;
  float fVar238;
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  vint4 ai;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar252;
  undefined1 auVar249 [32];
  undefined1 auVar248 [16];
  undefined1 auVar250 [32];
  undefined1 auVar251 [64];
  vint4 ai_1;
  undefined1 auVar253 [16];
  undefined1 auVar254 [32];
  vint4 ai_2;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [64];
  float fVar260;
  float fVar267;
  undefined1 auVar263 [32];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar265;
  float fVar266;
  undefined1 auVar264 [64];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  float fVar275;
  undefined1 auVar273 [32];
  undefined1 auVar274 [64];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [64];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [32];
  undefined1 auVar283 [64];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  float fVar289;
  undefined1 auVar288 [16];
  float fVar290;
  undefined1 auVar291 [64];
  undefined1 auVar292 [64];
  undefined1 auVar293 [32];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_b10;
  RTCFilterFunctionNArguments local_8d0;
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [32];
  undefined1 local_840 [16];
  undefined1 (*local_830) [32];
  ulong local_828;
  undefined1 local_820 [32];
  undefined1 local_800 [16];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [8];
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [16];
  Primitive *local_690;
  ulong local_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  undefined1 auStack_610 [16];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  RTCHitN local_460 [32];
  undefined1 local_440 [32];
  undefined4 local_420;
  undefined4 uStack_41c;
  undefined4 uStack_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [32];
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  uint local_360;
  uint uStack_35c;
  uint uStack_358;
  uint uStack_354;
  uint uStack_350;
  uint uStack_34c;
  uint uStack_348;
  uint uStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  ulong uStack_140;
  int aiStack_138 [66];
  
  uVar70 = (ulong)(byte)prim[1];
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 4 + 6)));
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 5 + 6)));
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 6 + 6)));
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0xf + 6)));
  lVar67 = uVar70 * 0x25;
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x11 + 6)));
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1a + 6)));
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1b + 6)));
  fVar2 = *(float *)(prim + lVar67 + 0x12);
  auVar286._4_4_ = fVar2;
  auVar286._0_4_ = fVar2;
  auVar286._8_4_ = fVar2;
  auVar286._12_4_ = fVar2;
  auVar90 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar75 = vsubps_avx(auVar90,*(undefined1 (*) [16])(prim + lVar67 + 6));
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1c + 6)));
  fVar260 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar67 + 0x16)) *
            *(float *)(prim + lVar67 + 0x1a);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar70 * 7 + 6);
  auVar94 = vpmovsxwd_avx(auVar90);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar70 * 0xb + 6);
  auVar270 = vpmovsxwd_avx(auVar89);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar70 * 9 + 6);
  auVar156 = vpmovsxwd_avx(auVar91);
  auVar72 = vpbroadcastd_avx512vl();
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar70 * 0xd + 6);
  auVar73 = vpmovsxwd_avx512vl(auVar85);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar70 * 0x12 + 6);
  auVar74 = vpmovsxwd_avx512vl(auVar3);
  auVar90 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar90 = vinsertps_avx512f(auVar90,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar288._0_4_ = fVar2 * auVar75._0_4_;
  auVar288._4_4_ = fVar2 * auVar75._4_4_;
  auVar288._8_4_ = fVar2 * auVar75._8_4_;
  auVar288._12_4_ = fVar2 * auVar75._12_4_;
  auVar75 = vmulps_avx512vl(auVar286,auVar90);
  auVar76 = vcvtdq2ps_avx512vl(auVar82);
  auVar77 = vcvtdq2ps_avx512vl(auVar81);
  auVar78 = vcvtdq2ps_avx512vl(auVar78);
  auVar79 = vcvtdq2ps_avx512vl(auVar79);
  auVar80 = vcvtdq2ps_avx512vl(auVar80);
  auVar90 = vcvtdq2ps_avx(auVar83);
  auVar89 = vcvtdq2ps_avx(auVar84);
  auVar91 = vcvtdq2ps_avx(auVar93);
  auVar85 = vcvtdq2ps_avx(auVar92);
  uVar179 = auVar75._0_4_;
  auVar268._4_4_ = uVar179;
  auVar268._0_4_ = uVar179;
  auVar268._8_4_ = uVar179;
  auVar268._12_4_ = uVar179;
  auVar3 = vshufps_avx(auVar75,auVar75,0x55);
  auVar82 = vshufps_avx(auVar75,auVar75,0xaa);
  auVar81 = vmulps_avx512vl(auVar82,auVar78);
  auVar180._0_4_ = auVar82._0_4_ * auVar90._0_4_;
  auVar180._4_4_ = auVar82._4_4_ * auVar90._4_4_;
  auVar180._8_4_ = auVar82._8_4_ * auVar90._8_4_;
  auVar180._12_4_ = auVar82._12_4_ * auVar90._12_4_;
  auVar75._0_4_ = auVar85._0_4_ * auVar82._0_4_;
  auVar75._4_4_ = auVar85._4_4_ * auVar82._4_4_;
  auVar75._8_4_ = auVar85._8_4_ * auVar82._8_4_;
  auVar75._12_4_ = auVar85._12_4_ * auVar82._12_4_;
  auVar82 = vfmadd231ps_avx512vl(auVar81,auVar3,auVar77);
  auVar81 = vfmadd231ps_avx512vl(auVar180,auVar3,auVar80);
  auVar3 = vfmadd231ps_fma(auVar75,auVar91,auVar3);
  auVar83 = vfmadd231ps_avx512vl(auVar82,auVar268,auVar76);
  auVar84 = vfmadd231ps_avx512vl(auVar81,auVar268,auVar79);
  auVar81 = vfmadd231ps_fma(auVar3,auVar89,auVar268);
  auVar284._4_4_ = auVar288._0_4_;
  auVar284._0_4_ = auVar288._0_4_;
  auVar284._8_4_ = auVar288._0_4_;
  auVar284._12_4_ = auVar288._0_4_;
  auVar3 = vshufps_avx(auVar288,auVar288,0x55);
  auVar82 = vshufps_avx(auVar288,auVar288,0xaa);
  auVar78 = vmulps_avx512vl(auVar82,auVar78);
  auVar269._0_4_ = auVar82._0_4_ * auVar90._0_4_;
  auVar269._4_4_ = auVar82._4_4_ * auVar90._4_4_;
  auVar269._8_4_ = auVar82._8_4_ * auVar90._8_4_;
  auVar269._12_4_ = auVar82._12_4_ * auVar90._12_4_;
  auVar217._0_4_ = auVar82._0_4_ * auVar85._0_4_;
  auVar217._4_4_ = auVar82._4_4_ * auVar85._4_4_;
  auVar217._8_4_ = auVar82._8_4_ * auVar85._8_4_;
  auVar217._12_4_ = auVar82._12_4_ * auVar85._12_4_;
  auVar85 = vfmadd231ps_avx512vl(auVar78,auVar3,auVar77);
  auVar82 = vfmadd231ps_avx512vl(auVar269,auVar3,auVar80);
  auVar90 = vfmadd231ps_fma(auVar217,auVar3,auVar91);
  auVar76 = vfmadd231ps_avx512vl(auVar85,auVar284,auVar76);
  auVar77 = vfmadd231ps_avx512vl(auVar82,auVar284,auVar79);
  auVar75 = vfmadd231ps_fma(auVar90,auVar284,auVar89);
  auVar279._8_4_ = 0x7fffffff;
  auVar279._0_8_ = 0x7fffffff7fffffff;
  auVar279._12_4_ = 0x7fffffff;
  auVar90 = vandps_avx(auVar279,auVar83);
  auVar276._8_4_ = 0x219392ef;
  auVar276._0_8_ = 0x219392ef219392ef;
  auVar276._12_4_ = 0x219392ef;
  uVar64 = vcmpps_avx512vl(auVar90,auVar276,1);
  bVar69 = (bool)((byte)uVar64 & 1);
  auVar86._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar83._0_4_;
  bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar83._4_4_;
  bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar83._8_4_;
  bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar83._12_4_;
  auVar90 = vandps_avx(auVar279,auVar84);
  uVar64 = vcmpps_avx512vl(auVar90,auVar276,1);
  bVar69 = (bool)((byte)uVar64 & 1);
  auVar87._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar84._0_4_;
  bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar84._4_4_;
  bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar84._8_4_;
  bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar84._12_4_;
  auVar90 = vandps_avx(auVar279,auVar81);
  uVar64 = vcmpps_avx512vl(auVar90,auVar276,1);
  bVar69 = (bool)((byte)uVar64 & 1);
  auVar88._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar81._0_4_;
  bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar81._4_4_;
  bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar81._8_4_;
  bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar81._12_4_;
  auVar89 = vrcp14ps_avx512vl(auVar86);
  auVar277._8_4_ = 0x3f800000;
  auVar277._0_8_ = 0x3f8000003f800000;
  auVar277._12_4_ = 0x3f800000;
  auVar90 = vfnmadd213ps_fma(auVar86,auVar89,auVar277);
  auVar85 = vfmadd132ps_fma(auVar90,auVar89,auVar89);
  auVar89 = vrcp14ps_avx512vl(auVar87);
  auVar90 = vfnmadd213ps_fma(auVar87,auVar89,auVar277);
  auVar3 = vfmadd132ps_fma(auVar90,auVar89,auVar89);
  auVar89 = vrcp14ps_avx512vl(auVar88);
  auVar90 = vfnmadd213ps_fma(auVar88,auVar89,auVar277);
  auVar93 = vfmadd132ps_fma(auVar90,auVar89,auVar89);
  auVar244._4_4_ = fVar260;
  auVar244._0_4_ = fVar260;
  auVar244._8_4_ = fVar260;
  auVar244._12_4_ = fVar260;
  auVar90 = vcvtdq2ps_avx(auVar94);
  auVar89 = vcvtdq2ps_avx(auVar270);
  auVar89 = vsubps_avx(auVar89,auVar90);
  auVar92 = vfmadd213ps_fma(auVar89,auVar244,auVar90);
  auVar90 = vcvtdq2ps_avx(auVar156);
  auVar89 = vcvtdq2ps_avx512vl(auVar73);
  auVar89 = vsubps_avx(auVar89,auVar90);
  auVar94 = vfmadd213ps_fma(auVar89,auVar244,auVar90);
  auVar89 = vcvtdq2ps_avx512vl(auVar74);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar70 * 0x16 + 6);
  auVar90 = vpmovsxwd_avx(auVar82);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,auVar89);
  auVar82 = vfmadd213ps_fma(auVar90,auVar244,auVar89);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar70 * 0x14 + 6);
  auVar90 = vpmovsxwd_avx(auVar81);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar70 * 0x18 + 6);
  auVar89 = vpmovsxwd_avx(auVar78);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar91 = vsubps_avx(auVar89,auVar90);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar70 * 0x1d + 6);
  auVar89 = vpmovsxwd_avx(auVar79);
  auVar91 = vfmadd213ps_fma(auVar91,auVar244,auVar90);
  auVar90 = vcvtdq2ps_avx(auVar89);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar70 * 0x21 + 6);
  auVar89 = vpmovsxwd_avx(auVar80);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar90);
  auVar81 = vfmadd213ps_fma(auVar89,auVar244,auVar90);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar70 * 0x1f + 6);
  auVar90 = vpmovsxwd_avx(auVar83);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar70 * 0x23 + 6);
  auVar89 = vpmovsxwd_avx(auVar84);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar90);
  auVar89 = vfmadd213ps_fma(auVar89,auVar244,auVar90);
  auVar90 = vsubps_avx512vl(auVar92,auVar76);
  auVar245._0_4_ = auVar85._0_4_ * auVar90._0_4_;
  auVar245._4_4_ = auVar85._4_4_ * auVar90._4_4_;
  auVar245._8_4_ = auVar85._8_4_ * auVar90._8_4_;
  auVar245._12_4_ = auVar85._12_4_ * auVar90._12_4_;
  auVar90 = vsubps_avx512vl(auVar94,auVar76);
  auVar74._0_4_ = auVar85._0_4_ * auVar90._0_4_;
  auVar74._4_4_ = auVar85._4_4_ * auVar90._4_4_;
  auVar74._8_4_ = auVar85._8_4_ * auVar90._8_4_;
  auVar74._12_4_ = auVar85._12_4_ * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar82,auVar77);
  auVar76._0_4_ = auVar3._0_4_ * auVar90._0_4_;
  auVar76._4_4_ = auVar3._4_4_ * auVar90._4_4_;
  auVar76._8_4_ = auVar3._8_4_ * auVar90._8_4_;
  auVar76._12_4_ = auVar3._12_4_ * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar91,auVar77);
  auVar73._0_4_ = auVar3._0_4_ * auVar90._0_4_;
  auVar73._4_4_ = auVar3._4_4_ * auVar90._4_4_;
  auVar73._8_4_ = auVar3._8_4_ * auVar90._8_4_;
  auVar73._12_4_ = auVar3._12_4_ * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar81,auVar75);
  auVar77._0_4_ = auVar93._0_4_ * auVar90._0_4_;
  auVar77._4_4_ = auVar93._4_4_ * auVar90._4_4_;
  auVar77._8_4_ = auVar93._8_4_ * auVar90._8_4_;
  auVar77._12_4_ = auVar93._12_4_ * auVar90._12_4_;
  auVar90 = vsubps_avx(auVar89,auVar75);
  auVar156._0_4_ = auVar93._0_4_ * auVar90._0_4_;
  auVar156._4_4_ = auVar93._4_4_ * auVar90._4_4_;
  auVar156._8_4_ = auVar93._8_4_ * auVar90._8_4_;
  auVar156._12_4_ = auVar93._12_4_ * auVar90._12_4_;
  auVar90 = vpminsd_avx(auVar245,auVar74);
  auVar89 = vpminsd_avx(auVar76,auVar73);
  auVar90 = vmaxps_avx(auVar90,auVar89);
  auVar89 = vpminsd_avx(auVar77,auVar156);
  uVar179 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar93._4_4_ = uVar179;
  auVar93._0_4_ = uVar179;
  auVar93._8_4_ = uVar179;
  auVar93._12_4_ = uVar179;
  auVar89 = vmaxps_avx512vl(auVar89,auVar93);
  auVar90 = vmaxps_avx(auVar90,auVar89);
  auVar92._8_4_ = 0x3f7ffffa;
  auVar92._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar92._12_4_ = 0x3f7ffffa;
  local_520 = vmulps_avx512vl(auVar90,auVar92);
  auVar90 = vpmaxsd_avx(auVar245,auVar74);
  auVar89 = vpmaxsd_avx(auVar76,auVar73);
  auVar90 = vminps_avx(auVar90,auVar89);
  auVar89 = vpmaxsd_avx(auVar77,auVar156);
  uVar179 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar94._4_4_ = uVar179;
  auVar94._0_4_ = uVar179;
  auVar94._8_4_ = uVar179;
  auVar94._12_4_ = uVar179;
  auVar89 = vminps_avx512vl(auVar89,auVar94);
  auVar90 = vminps_avx(auVar90,auVar89);
  auVar270._8_4_ = 0x3f800003;
  auVar270._0_8_ = 0x3f8000033f800003;
  auVar270._12_4_ = 0x3f800003;
  auVar90 = vmulps_avx512vl(auVar90,auVar270);
  uVar21 = vcmpps_avx512vl(local_520,auVar90,2);
  uVar24 = vpcmpgtd_avx512vl(auVar72,_DAT_01f4ad30);
  local_688 = CONCAT44((int)((ulong)context >> 0x20),(uint)((byte)uVar21 & 0xf & (byte)uVar24));
  local_830 = (undefined1 (*) [32])&local_380;
  local_500 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_690 = prim;
LAB_018d4ded:
  auVar110._8_4_ = 0x7fffffff;
  auVar110._0_8_ = 0x7fffffff7fffffff;
  auVar110._12_4_ = 0x7fffffff;
  auVar110._16_4_ = 0x7fffffff;
  auVar110._20_4_ = 0x7fffffff;
  auVar110._24_4_ = 0x7fffffff;
  auVar110._28_4_ = 0x7fffffff;
  auVar264 = ZEXT3264(auVar110);
  if (local_688 == 0) {
    return;
  }
  lVar67 = 0;
  for (uVar64 = local_688; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
    lVar67 = lVar67 + 1;
  }
  uVar4 = *(uint *)(local_690 + 2);
  local_828 = (ulong)*(uint *)(local_690 + lVar67 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[uVar4].ptr;
  uVar64 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           local_828 *
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar2 = (pGVar6->time_range).lower;
  fVar2 = pGVar6->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0xe0) - fVar2) / ((pGVar6->time_range).upper - fVar2));
  auVar90 = vroundss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),9);
  auVar90 = vminss_avx(auVar90,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
  auVar90 = vmaxss_avx(ZEXT816(0) << 0x20,auVar90);
  fVar2 = fVar2 - auVar90._0_4_;
  _Var7 = pGVar6[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar68 = (long)(int)auVar90._0_4_ * 0x38;
  lVar67 = *(long *)(_Var7 + 0x10 + lVar68);
  lVar8 = *(long *)(_Var7 + 0x38 + lVar68);
  lVar9 = *(long *)(_Var7 + 0x48 + lVar68);
  pfVar1 = (float *)(lVar8 + uVar64 * lVar9);
  auVar199._0_4_ = fVar2 * *pfVar1;
  auVar199._4_4_ = fVar2 * pfVar1[1];
  auVar199._8_4_ = fVar2 * pfVar1[2];
  auVar199._12_4_ = fVar2 * pfVar1[3];
  pfVar1 = (float *)(lVar8 + (uVar64 + 1) * lVar9);
  auVar218._0_4_ = fVar2 * *pfVar1;
  auVar218._4_4_ = fVar2 * pfVar1[1];
  auVar218._8_4_ = fVar2 * pfVar1[2];
  auVar218._12_4_ = fVar2 * pfVar1[3];
  pfVar1 = (float *)(lVar8 + (uVar64 + 2) * lVar9);
  auVar239._0_4_ = fVar2 * *pfVar1;
  auVar239._4_4_ = fVar2 * pfVar1[1];
  auVar239._8_4_ = fVar2 * pfVar1[2];
  auVar239._12_4_ = fVar2 * pfVar1[3];
  pfVar1 = (float *)(lVar8 + lVar9 * (uVar64 + 3));
  auVar181._0_4_ = fVar2 * *pfVar1;
  auVar181._4_4_ = fVar2 * pfVar1[1];
  auVar181._8_4_ = fVar2 * pfVar1[2];
  auVar181._12_4_ = fVar2 * pfVar1[3];
  lVar8 = *(long *)(_Var7 + lVar68);
  fVar2 = 1.0 - fVar2;
  auVar157._4_4_ = fVar2;
  auVar157._0_4_ = fVar2;
  auVar157._8_4_ = fVar2;
  auVar157._12_4_ = fVar2;
  auVar91 = vfmadd231ps_fma(auVar199,auVar157,*(undefined1 (*) [16])(lVar8 + lVar67 * uVar64));
  auVar85 = vfmadd231ps_fma(auVar218,auVar157,*(undefined1 (*) [16])(lVar8 + lVar67 * (uVar64 + 1)))
  ;
  auVar3 = vfmadd231ps_fma(auVar239,auVar157,*(undefined1 (*) [16])(lVar8 + lVar67 * (uVar64 + 2)));
  auVar82 = vfmadd231ps_fma(auVar181,auVar157,*(undefined1 (*) [16])(lVar8 + lVar67 * (uVar64 + 3)))
  ;
  auVar90 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar89 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar179 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar285._4_4_ = uVar179;
  auVar285._0_4_ = uVar179;
  auVar285._8_4_ = uVar179;
  auVar285._12_4_ = uVar179;
  local_5c0._16_4_ = uVar179;
  local_5c0._0_16_ = auVar285;
  local_5c0._20_4_ = uVar179;
  local_5c0._24_4_ = uVar179;
  local_5c0._28_4_ = uVar179;
  uVar179 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar287._4_4_ = uVar179;
  auVar287._0_4_ = uVar179;
  auVar287._8_4_ = uVar179;
  auVar287._12_4_ = uVar179;
  local_480._16_4_ = uVar179;
  local_480._0_16_ = auVar287;
  local_480._20_4_ = uVar179;
  local_480._24_4_ = uVar179;
  local_480._28_4_ = uVar179;
  auVar90 = vunpcklps_avx(auVar285,auVar287);
  local_5e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar79 = local_5e0._0_16_;
  local_7f0 = vinsertps_avx512f(auVar90,auVar79,0x28);
  auVar274 = ZEXT1664(local_7f0);
  auVar246._0_4_ = auVar91._0_4_ + auVar85._0_4_ + auVar3._0_4_ + auVar82._0_4_;
  auVar246._4_4_ = auVar91._4_4_ + auVar85._4_4_ + auVar3._4_4_ + auVar82._4_4_;
  auVar246._8_4_ = auVar91._8_4_ + auVar85._8_4_ + auVar3._8_4_ + auVar82._8_4_;
  auVar246._12_4_ = auVar91._12_4_ + auVar85._12_4_ + auVar3._12_4_ + auVar82._12_4_;
  auVar72._8_4_ = 0x3e800000;
  auVar72._0_8_ = 0x3e8000003e800000;
  auVar72._12_4_ = 0x3e800000;
  auVar90 = vmulps_avx512vl(auVar246,auVar72);
  auVar90 = vsubps_avx(auVar90,auVar89);
  auVar90 = vdpps_avx(auVar90,local_7f0,0x7f);
  local_800 = vdpps_avx(local_7f0,local_7f0,0x7f);
  auVar278 = ZEXT1664(local_800);
  fVar2 = *(float *)(ray + k * 4 + 0x60);
  auVar283 = ZEXT464((uint)fVar2);
  auVar253._4_12_ = ZEXT812(0) << 0x20;
  auVar253._0_4_ = local_800._0_4_;
  auVar78 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar253);
  auVar81 = vfnmadd213ss_fma(auVar78,local_800,ZEXT416(0x40000000));
  local_2e0 = auVar90._0_4_ * auVar78._0_4_ * auVar81._0_4_;
  auVar251 = ZEXT3264(_DAT_01f7b040);
  auVar255._4_4_ = local_2e0;
  auVar255._0_4_ = local_2e0;
  auVar255._8_4_ = local_2e0;
  auVar255._12_4_ = local_2e0;
  fStack_570 = local_2e0;
  _local_580 = auVar255;
  fStack_56c = local_2e0;
  fStack_568 = local_2e0;
  fStack_564 = local_2e0;
  auVar90 = vfmadd231ps_fma(auVar89,local_7f0,auVar255);
  auVar90 = vblendps_avx(auVar90,ZEXT816(0) << 0x40,8);
  auVar89 = vsubps_avx(auVar91,auVar90);
  auVar259 = ZEXT1664(auVar89);
  auVar91 = vsubps_avx(auVar3,auVar90);
  auVar85 = vsubps_avx(auVar85,auVar90);
  auVar90 = vsubps_avx(auVar82,auVar90);
  auVar271 = ZEXT1664(auVar90);
  auVar95 = vbroadcastss_avx512vl(auVar89);
  auVar107._8_4_ = 1;
  auVar107._0_8_ = 0x100000001;
  auVar107._12_4_ = 1;
  auVar107._16_4_ = 1;
  auVar107._20_4_ = 1;
  auVar107._24_4_ = 1;
  auVar107._28_4_ = 1;
  local_780 = ZEXT1632(auVar89);
  auVar96 = vpermps_avx512vl(auVar107,local_780);
  auVar291 = ZEXT3264(auVar96);
  auVar108._8_4_ = 2;
  auVar108._0_8_ = 0x200000002;
  auVar108._12_4_ = 2;
  auVar108._16_4_ = 2;
  auVar108._20_4_ = 2;
  auVar108._24_4_ = 2;
  auVar108._28_4_ = 2;
  auVar97 = vpermps_avx512vl(auVar108,local_780);
  auVar292 = ZEXT3264(auVar97);
  auVar111._8_4_ = 3;
  auVar111._0_8_ = 0x300000003;
  auVar111._12_4_ = 3;
  auVar111._16_4_ = 3;
  auVar111._20_4_ = 3;
  auVar111._24_4_ = 3;
  auVar111._28_4_ = 3;
  auVar98 = vpermps_avx512vl(auVar111,local_780);
  auVar99 = vbroadcastss_avx512vl(auVar85);
  local_7c0 = ZEXT1632(auVar85);
  auVar100 = vpermps_avx512vl(auVar107,local_7c0);
  auVar101 = vpermps_avx512vl(auVar108,local_7c0);
  auVar102 = vpermps_avx512vl(auVar111,local_7c0);
  auVar103 = vbroadcastss_avx512vl(auVar91);
  local_7a0 = ZEXT1632(auVar91);
  auVar104 = vpermps_avx512vl(auVar107,local_7a0);
  auVar105 = vpermps_avx512vl(auVar108,local_7a0);
  auVar106 = vpermps_avx512vl(auVar111,local_7a0);
  local_260 = vbroadcastss_avx512vl(auVar90);
  _local_7e0 = ZEXT1632(auVar90);
  local_280 = vpermps_avx2(auVar107,_local_7e0);
  local_2a0 = vpermps_avx512vl(auVar108,_local_7e0);
  local_2c0 = vpermps_avx2(auVar111,_local_7e0);
  auVar90 = vmulss_avx512f(auVar79,auVar79);
  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),local_480,local_480);
  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),local_5c0,local_5c0);
  local_220._0_4_ = auVar90._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  local_240 = vandps_avx(auVar110,local_220);
  local_6f0 = ZEXT416((uint)local_2e0);
  local_2e0 = fVar2 - local_2e0;
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_4a0 = vpbroadcastd_avx512vl();
  uVar64 = 0;
  local_b10 = 1;
  local_4c0 = vpbroadcastd_avx512vl();
  auVar90 = vsqrtss_avx(local_800,local_800);
  auVar89 = vsqrtss_avx(local_800,local_800);
  local_510 = ZEXT816(0x3f80000000000000);
  do {
    auVar91 = vmovshdup_avx(local_510);
    auVar91 = vsubps_avx(auVar91,local_510);
    auVar164._0_4_ = auVar91._0_4_;
    fVar20 = auVar164._0_4_ * 0.04761905;
    uVar179 = local_510._0_4_;
    local_860._4_4_ = uVar179;
    local_860._0_4_ = uVar179;
    local_860._8_4_ = uVar179;
    local_860._12_4_ = uVar179;
    local_860._16_4_ = uVar179;
    local_860._20_4_ = uVar179;
    local_860._24_4_ = uVar179;
    local_860._28_4_ = uVar179;
    auVar164._4_4_ = auVar164._0_4_;
    auVar164._8_4_ = auVar164._0_4_;
    auVar164._12_4_ = auVar164._0_4_;
    auVar164._16_4_ = auVar164._0_4_;
    auVar164._20_4_ = auVar164._0_4_;
    auVar164._24_4_ = auVar164._0_4_;
    auVar164._28_4_ = auVar164._0_4_;
    auVar91 = vfmadd231ps_fma(local_860,auVar164,auVar251._0_32_);
    auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar108 = vsubps_avx512vl(auVar107,ZEXT1632(auVar91));
    fVar260 = auVar108._0_4_;
    fVar266 = auVar108._4_4_;
    fVar236 = auVar108._8_4_;
    fVar238 = auVar108._12_4_;
    fVar290 = auVar108._16_4_;
    fVar198 = auVar108._20_4_;
    fVar19 = auVar108._24_4_;
    fVar155 = fVar260 * fVar260 * fVar260;
    fVar173 = fVar266 * fVar266 * fVar266;
    auVar112._4_4_ = fVar173;
    auVar112._0_4_ = fVar155;
    fVar174 = fVar236 * fVar236 * fVar236;
    auVar112._8_4_ = fVar174;
    fVar175 = fVar238 * fVar238 * fVar238;
    auVar112._12_4_ = fVar175;
    fVar176 = fVar290 * fVar290 * fVar290;
    auVar112._16_4_ = fVar176;
    fVar177 = fVar198 * fVar198 * fVar198;
    auVar112._20_4_ = fVar177;
    fVar178 = fVar19 * fVar19 * fVar19;
    auVar112._24_4_ = fVar178;
    auVar112._28_4_ = auVar164._0_4_;
    auVar109 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar110 = vmulps_avx512vl(auVar112,auVar109);
    fVar265 = auVar91._0_4_;
    fVar267 = auVar91._4_4_;
    fVar237 = auVar91._8_4_;
    fVar289 = auVar91._12_4_;
    fVar197 = fVar265 * fVar265 * fVar265;
    fVar214 = fVar267 * fVar267 * fVar267;
    fVar215 = fVar237 * fVar237 * fVar237;
    fVar216 = fVar289 * fVar289 * fVar289;
    auVar272._0_4_ = fVar265 * fVar260;
    auVar272._4_4_ = fVar267 * fVar266;
    auVar272._8_4_ = fVar237 * fVar236;
    auVar272._12_4_ = fVar289 * fVar238;
    auVar272._16_4_ = fVar290 * 0.0;
    auVar272._20_4_ = fVar198 * 0.0;
    auVar272._28_36_ = auVar271._28_36_;
    auVar272._24_4_ = fVar19 * 0.0;
    auVar111 = vmulps_avx512vl(ZEXT1632(CONCAT412(fVar216,CONCAT48(fVar215,CONCAT44(fVar214,fVar197)
                                                                  ))),auVar109);
    fVar275 = auVar111._28_4_ + auVar164._0_4_;
    fVar252 = fVar275 + auVar278._28_4_ + auVar251._28_4_;
    auVar117._4_4_ = fVar173 * 0.16666667;
    auVar117._0_4_ = fVar155 * 0.16666667;
    auVar117._8_4_ = fVar174 * 0.16666667;
    auVar117._12_4_ = fVar175 * 0.16666667;
    auVar117._16_4_ = fVar176 * 0.16666667;
    auVar117._20_4_ = fVar177 * 0.16666667;
    auVar117._24_4_ = fVar178 * 0.16666667;
    auVar117._28_4_ = fVar275;
    auVar114._4_4_ =
         (auVar272._4_4_ * fVar266 * 12.0 + auVar272._4_4_ * fVar267 * 6.0 +
         fVar214 + auVar110._4_4_) * 0.16666667;
    auVar114._0_4_ =
         (auVar272._0_4_ * fVar260 * 12.0 + auVar272._0_4_ * fVar265 * 6.0 +
         fVar197 + auVar110._0_4_) * 0.16666667;
    auVar114._8_4_ =
         (auVar272._8_4_ * fVar236 * 12.0 + auVar272._8_4_ * fVar237 * 6.0 +
         fVar215 + auVar110._8_4_) * 0.16666667;
    auVar114._12_4_ =
         (auVar272._12_4_ * fVar238 * 12.0 + auVar272._12_4_ * fVar289 * 6.0 +
         fVar216 + auVar110._12_4_) * 0.16666667;
    auVar114._16_4_ =
         (auVar272._16_4_ * fVar290 * 12.0 + auVar272._16_4_ * 0.0 * 6.0 + auVar110._16_4_ + 0.0) *
         0.16666667;
    auVar114._20_4_ =
         (auVar272._20_4_ * fVar198 * 12.0 + auVar272._20_4_ * 0.0 * 6.0 + auVar110._20_4_ + 0.0) *
         0.16666667;
    auVar114._24_4_ =
         (auVar272._24_4_ * fVar19 * 12.0 + auVar272._24_4_ * 0.0 * 6.0 + auVar110._24_4_ + 0.0) *
         0.16666667;
    auVar114._28_4_ = auVar278._28_4_;
    auVar115._4_4_ =
         (auVar111._4_4_ + fVar173 +
         auVar272._4_4_ * fVar267 * 12.0 + auVar272._4_4_ * fVar266 * 6.0) * 0.16666667;
    auVar115._0_4_ =
         (auVar111._0_4_ + fVar155 +
         auVar272._0_4_ * fVar265 * 12.0 + auVar272._0_4_ * fVar260 * 6.0) * 0.16666667;
    auVar115._8_4_ =
         (auVar111._8_4_ + fVar174 +
         auVar272._8_4_ * fVar237 * 12.0 + auVar272._8_4_ * fVar236 * 6.0) * 0.16666667;
    auVar115._12_4_ =
         (auVar111._12_4_ + fVar175 +
         auVar272._12_4_ * fVar289 * 12.0 + auVar272._12_4_ * fVar238 * 6.0) * 0.16666667;
    auVar115._16_4_ =
         (auVar111._16_4_ + fVar176 + auVar272._16_4_ * 0.0 * 12.0 + auVar272._16_4_ * fVar290 * 6.0
         ) * 0.16666667;
    auVar115._20_4_ =
         (auVar111._20_4_ + fVar177 + auVar272._20_4_ * 0.0 * 12.0 + auVar272._20_4_ * fVar198 * 6.0
         ) * 0.16666667;
    auVar115._24_4_ =
         (auVar111._24_4_ + fVar178 + auVar272._24_4_ * 0.0 * 12.0 + auVar272._24_4_ * fVar19 * 6.0)
         * 0.16666667;
    auVar115._28_4_ = auVar283._28_4_;
    fVar197 = fVar197 * 0.16666667;
    fVar214 = fVar214 * 0.16666667;
    fVar215 = fVar215 * 0.16666667;
    fVar216 = fVar216 * 0.16666667;
    auVar116._28_4_ = fVar252;
    auVar116._0_28_ = ZEXT1628(CONCAT412(fVar216,CONCAT48(fVar215,CONCAT44(fVar214,fVar197))));
    auVar111 = vmulps_avx512vl(local_260,auVar116);
    auVar119._4_4_ = local_280._4_4_ * fVar214;
    auVar119._0_4_ = local_280._0_4_ * fVar197;
    auVar119._8_4_ = local_280._8_4_ * fVar215;
    auVar119._12_4_ = local_280._12_4_ * fVar216;
    auVar119._16_4_ = local_280._16_4_ * 0.0;
    auVar119._20_4_ = local_280._20_4_ * 0.0;
    auVar119._24_4_ = local_280._24_4_ * 0.0;
    auVar119._28_4_ = auVar274._28_4_ + auVar283._28_4_ + auVar110._28_4_ + 0.0;
    auVar110 = vmulps_avx512vl(local_2a0,auVar116);
    auVar120._4_4_ = local_2c0._4_4_ * fVar214;
    auVar120._0_4_ = local_2c0._0_4_ * fVar197;
    auVar120._8_4_ = local_2c0._8_4_ * fVar215;
    auVar120._12_4_ = local_2c0._12_4_ * fVar216;
    auVar120._16_4_ = local_2c0._16_4_ * 0.0;
    auVar120._20_4_ = local_2c0._20_4_ * 0.0;
    auVar120._24_4_ = local_2c0._24_4_ * 0.0;
    auVar120._28_4_ = fVar252;
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar115,auVar103);
    auVar112 = vfmadd231ps_avx512vl(auVar119,auVar115,auVar104);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar115,auVar105);
    auVar113 = vfmadd231ps_avx512vl(auVar120,auVar106,auVar115);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar114,auVar99);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar114,auVar100);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar114,auVar101);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar102,auVar114);
    auVar114 = vfmadd231ps_avx512vl(auVar111,auVar117,auVar95);
    auVar115 = vfmadd231ps_avx512vl(auVar112,auVar117,auVar291._0_32_);
    auVar116 = vfmadd231ps_avx512vl(auVar110,auVar117,auVar292._0_32_);
    auVar111 = vfmadd231ps_avx512vl(auVar113,auVar98,auVar117);
    auVar117 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar112 = vxorps_avx512vl(auVar108,auVar117);
    auVar113 = vxorps_avx512vl(ZEXT1632(auVar91),auVar117);
    auVar132._0_4_ = auVar113._0_4_ * fVar265;
    auVar132._4_4_ = auVar113._4_4_ * fVar267;
    auVar132._8_4_ = auVar113._8_4_ * fVar237;
    auVar132._12_4_ = auVar113._12_4_ * fVar289;
    auVar132._16_4_ = auVar113._16_4_ * 0.0;
    auVar132._20_4_ = auVar113._20_4_ * 0.0;
    auVar132._24_4_ = auVar113._24_4_ * 0.0;
    auVar132._28_4_ = 0;
    auVar118 = vmulps_avx512vl(auVar272._0_32_,auVar109);
    auVar110 = vsubps_avx(auVar132,auVar118);
    auVar121._4_4_ = auVar112._4_4_ * fVar266 * 0.5;
    auVar121._0_4_ = auVar112._0_4_ * fVar260 * 0.5;
    auVar121._8_4_ = auVar112._8_4_ * fVar236 * 0.5;
    auVar121._12_4_ = auVar112._12_4_ * fVar238 * 0.5;
    auVar121._16_4_ = auVar112._16_4_ * fVar290 * 0.5;
    auVar121._20_4_ = auVar112._20_4_ * fVar198 * 0.5;
    auVar121._24_4_ = auVar112._24_4_ * fVar19 * 0.5;
    auVar121._28_4_ = auVar108._28_4_;
    auVar122._4_4_ = auVar110._4_4_ * 0.5;
    auVar122._0_4_ = auVar110._0_4_ * 0.5;
    auVar122._8_4_ = auVar110._8_4_ * 0.5;
    auVar122._12_4_ = auVar110._12_4_ * 0.5;
    auVar122._16_4_ = auVar110._16_4_ * 0.5;
    auVar122._20_4_ = auVar110._20_4_ * 0.5;
    auVar122._24_4_ = auVar110._24_4_ * 0.5;
    auVar122._28_4_ = auVar110._28_4_;
    auVar123._4_4_ = (auVar118._4_4_ + fVar266 * fVar266) * 0.5;
    auVar123._0_4_ = (auVar118._0_4_ + fVar260 * fVar260) * 0.5;
    auVar123._8_4_ = (auVar118._8_4_ + fVar236 * fVar236) * 0.5;
    auVar123._12_4_ = (auVar118._12_4_ + fVar238 * fVar238) * 0.5;
    auVar123._16_4_ = (auVar118._16_4_ + fVar290 * fVar290) * 0.5;
    auVar123._20_4_ = (auVar118._20_4_ + fVar198 * fVar198) * 0.5;
    auVar123._24_4_ = (auVar118._24_4_ + fVar19 * fVar19) * 0.5;
    auVar123._28_4_ = auVar118._28_4_ + auVar259._28_4_;
    fVar260 = fVar265 * fVar265 * 0.5;
    fVar265 = fVar267 * fVar267 * 0.5;
    fVar266 = fVar237 * fVar237 * 0.5;
    fVar267 = fVar289 * fVar289 * 0.5;
    auVar124._28_4_ = auVar264._28_4_;
    auVar124._0_28_ = ZEXT1628(CONCAT412(fVar267,CONCAT48(fVar266,CONCAT44(fVar265,fVar260))));
    auVar110 = vmulps_avx512vl(local_260,auVar124);
    auVar128._4_4_ = local_280._4_4_ * fVar265;
    auVar128._0_4_ = local_280._0_4_ * fVar260;
    auVar128._8_4_ = local_280._8_4_ * fVar266;
    auVar128._12_4_ = local_280._12_4_ * fVar267;
    auVar128._16_4_ = local_280._16_4_ * 0.0;
    auVar128._20_4_ = local_280._20_4_ * 0.0;
    auVar128._24_4_ = local_280._24_4_ * 0.0;
    auVar128._28_4_ = auVar113._28_4_;
    auVar108 = vmulps_avx512vl(local_2a0,auVar124);
    auVar129._4_4_ = fVar265 * local_2c0._4_4_;
    auVar129._0_4_ = fVar260 * local_2c0._0_4_;
    auVar129._8_4_ = fVar266 * local_2c0._8_4_;
    auVar129._12_4_ = fVar267 * local_2c0._12_4_;
    auVar129._16_4_ = local_2c0._16_4_ * 0.0;
    auVar129._20_4_ = local_2c0._20_4_ * 0.0;
    auVar129._24_4_ = local_2c0._24_4_ * 0.0;
    auVar129._28_4_ = auVar264._28_4_;
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar123,auVar103);
    auVar112 = vfmadd231ps_avx512vl(auVar128,auVar123,auVar104);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar123,auVar105);
    auVar91 = vfmadd231ps_fma(auVar129,auVar106,auVar123);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar122,auVar99);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar122,auVar100);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar122,auVar101);
    auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar102,auVar122);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar121,auVar95);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar121,auVar291._0_32_);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar121,auVar292._0_32_);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar98,auVar121);
    auVar136._4_4_ = auVar110._4_4_ * fVar20;
    auVar136._0_4_ = auVar110._0_4_ * fVar20;
    auVar136._8_4_ = auVar110._8_4_ * fVar20;
    auVar136._12_4_ = auVar110._12_4_ * fVar20;
    auVar136._16_4_ = auVar110._16_4_ * fVar20;
    auVar136._20_4_ = auVar110._20_4_ * fVar20;
    auVar136._24_4_ = auVar110._24_4_ * fVar20;
    auVar136._28_4_ = auVar106._28_4_;
    auVar283 = ZEXT3264(auVar136);
    auVar137._4_4_ = auVar112._4_4_ * fVar20;
    auVar137._0_4_ = auVar112._0_4_ * fVar20;
    auVar137._8_4_ = auVar112._8_4_ * fVar20;
    auVar137._12_4_ = auVar112._12_4_ * fVar20;
    auVar137._16_4_ = auVar112._16_4_ * fVar20;
    auVar137._20_4_ = auVar112._20_4_ * fVar20;
    auVar137._24_4_ = auVar112._24_4_ * fVar20;
    auVar137._28_4_ = 0x3e2aaaab;
    auVar138._4_4_ = auVar108._4_4_ * fVar20;
    auVar138._0_4_ = auVar108._0_4_ * fVar20;
    auVar138._8_4_ = auVar108._8_4_ * fVar20;
    auVar138._12_4_ = auVar108._12_4_ * fVar20;
    auVar138._16_4_ = auVar108._16_4_ * fVar20;
    auVar138._20_4_ = auVar108._20_4_ * fVar20;
    auVar138._24_4_ = auVar108._24_4_ * fVar20;
    auVar138._28_4_ = 0x40c00000;
    fVar260 = auVar113._0_4_ * fVar20;
    fVar265 = auVar113._4_4_ * fVar20;
    auVar130._4_4_ = fVar265;
    auVar130._0_4_ = fVar260;
    fVar266 = auVar113._8_4_ * fVar20;
    auVar130._8_4_ = fVar266;
    fVar267 = auVar113._12_4_ * fVar20;
    auVar130._12_4_ = fVar267;
    fVar236 = auVar113._16_4_ * fVar20;
    auVar130._16_4_ = fVar236;
    fVar237 = auVar113._20_4_ * fVar20;
    auVar130._20_4_ = fVar237;
    fVar238 = auVar113._24_4_ * fVar20;
    auVar130._24_4_ = fVar238;
    auVar130._28_4_ = fVar20;
    auVar91 = vxorps_avx512vl(auVar107._0_16_,auVar107._0_16_);
    auVar119 = vpermt2ps_avx512vl(auVar114,_DAT_01fb9fc0,ZEXT1632(auVar91));
    auVar271 = ZEXT3264(auVar119);
    auVar120 = vpermt2ps_avx512vl(auVar115,_DAT_01fb9fc0,ZEXT1632(auVar91));
    auVar274 = ZEXT3264(auVar120);
    auVar108 = ZEXT1632(auVar91);
    auVar121 = vpermt2ps_avx512vl(auVar116,_DAT_01fb9fc0,auVar108);
    auVar278 = ZEXT3264(auVar121);
    auVar133._0_4_ = fVar260 + auVar111._0_4_;
    auVar133._4_4_ = fVar265 + auVar111._4_4_;
    auVar133._8_4_ = fVar266 + auVar111._8_4_;
    auVar133._12_4_ = fVar267 + auVar111._12_4_;
    auVar133._16_4_ = fVar236 + auVar111._16_4_;
    auVar133._20_4_ = fVar237 + auVar111._20_4_;
    auVar133._24_4_ = fVar238 + auVar111._24_4_;
    auVar133._28_4_ = fVar20 + auVar111._28_4_;
    auVar110 = vmaxps_avx(auVar111,auVar133);
    auVar107 = vminps_avx(auVar111,auVar133);
    auVar118 = vpermt2ps_avx512vl(auVar111,_DAT_01fb9fc0,auVar108);
    auVar122 = vpermt2ps_avx512vl(auVar136,_DAT_01fb9fc0,auVar108);
    auVar123 = vpermt2ps_avx512vl(auVar137,_DAT_01fb9fc0,auVar108);
    auVar293 = ZEXT1632(auVar91);
    auVar124 = vpermt2ps_avx512vl(auVar138,_DAT_01fb9fc0,auVar293);
    auVar108 = vpermt2ps_avx512vl(auVar130,_DAT_01fb9fc0,auVar293);
    auVar125 = vsubps_avx512vl(auVar118,auVar108);
    auVar108 = vsubps_avx(auVar119,auVar114);
    auVar264 = ZEXT3264(auVar108);
    auVar111 = vsubps_avx(auVar120,auVar115);
    auVar259 = ZEXT3264(auVar111);
    auVar112 = vsubps_avx(auVar121,auVar116);
    auVar113 = vmulps_avx512vl(auVar111,auVar138);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar137,auVar112);
    auVar126 = vmulps_avx512vl(auVar112,auVar136);
    auVar126 = vfmsub231ps_avx512vl(auVar126,auVar138,auVar108);
    auVar127 = vmulps_avx512vl(auVar108,auVar137);
    auVar127 = vfmsub231ps_avx512vl(auVar127,auVar136,auVar111);
    auVar127 = vmulps_avx512vl(auVar127,auVar127);
    auVar126 = vfmadd231ps_avx512vl(auVar127,auVar126,auVar126);
    auVar126 = vfmadd231ps_avx512vl(auVar126,auVar113,auVar113);
    auVar113 = vmulps_avx512vl(auVar112,auVar112);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar111,auVar111);
    auVar127 = vfmadd231ps_avx512vl(auVar113,auVar108,auVar108);
    auVar128 = vrcp14ps_avx512vl(auVar127);
    auVar113._8_4_ = 0x3f800000;
    auVar113._0_8_ = 0x3f8000003f800000;
    auVar113._12_4_ = 0x3f800000;
    auVar113._16_4_ = 0x3f800000;
    auVar113._20_4_ = 0x3f800000;
    auVar113._24_4_ = 0x3f800000;
    auVar113._28_4_ = 0x3f800000;
    auVar113 = vfnmadd213ps_avx512vl(auVar128,auVar127,auVar113);
    auVar113 = vfmadd132ps_avx512vl(auVar113,auVar128,auVar128);
    auVar126 = vmulps_avx512vl(auVar126,auVar113);
    auVar128 = vmulps_avx512vl(auVar111,auVar124);
    auVar128 = vfmsub231ps_avx512vl(auVar128,auVar123,auVar112);
    auVar129 = vmulps_avx512vl(auVar112,auVar122);
    auVar129 = vfmsub231ps_avx512vl(auVar129,auVar124,auVar108);
    auVar130 = vmulps_avx512vl(auVar108,auVar123);
    auVar130 = vfmsub231ps_avx512vl(auVar130,auVar122,auVar111);
    auVar130 = vmulps_avx512vl(auVar130,auVar130);
    auVar129 = vfmadd231ps_avx512vl(auVar130,auVar129,auVar129);
    auVar128 = vfmadd231ps_avx512vl(auVar129,auVar128,auVar128);
    auVar113 = vmulps_avx512vl(auVar128,auVar113);
    auVar113 = vmaxps_avx512vl(auVar126,auVar113);
    auVar113 = vsqrtps_avx512vl(auVar113);
    auVar126 = vmaxps_avx512vl(auVar125,auVar118);
    auVar110 = vmaxps_avx512vl(auVar110,auVar126);
    auVar128 = vaddps_avx512vl(auVar113,auVar110);
    auVar110 = vminps_avx512vl(auVar125,auVar118);
    auVar110 = vminps_avx(auVar107,auVar110);
    auVar110 = vsubps_avx512vl(auVar110,auVar113);
    auVar118._8_4_ = 0x3f800002;
    auVar118._0_8_ = 0x3f8000023f800002;
    auVar118._12_4_ = 0x3f800002;
    auVar118._16_4_ = 0x3f800002;
    auVar118._20_4_ = 0x3f800002;
    auVar118._24_4_ = 0x3f800002;
    auVar118._28_4_ = 0x3f800002;
    auVar107 = vmulps_avx512vl(auVar128,auVar118);
    auVar125._8_4_ = 0x3f7ffffc;
    auVar125._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar125._12_4_ = 0x3f7ffffc;
    auVar125._16_4_ = 0x3f7ffffc;
    auVar125._20_4_ = 0x3f7ffffc;
    auVar125._24_4_ = 0x3f7ffffc;
    auVar125._28_4_ = 0x3f7ffffc;
    auVar110 = vmulps_avx512vl(auVar110,auVar125);
    auVar107 = vmulps_avx512vl(auVar107,auVar107);
    auVar113 = vrsqrt14ps_avx512vl(auVar127);
    auVar126._8_4_ = 0xbf000000;
    auVar126._0_8_ = 0xbf000000bf000000;
    auVar126._12_4_ = 0xbf000000;
    auVar126._16_4_ = 0xbf000000;
    auVar126._20_4_ = 0xbf000000;
    auVar126._24_4_ = 0xbf000000;
    auVar126._28_4_ = 0xbf000000;
    auVar118 = vmulps_avx512vl(auVar127,auVar126);
    fVar260 = auVar113._0_4_;
    fVar265 = auVar113._4_4_;
    fVar266 = auVar113._8_4_;
    fVar267 = auVar113._12_4_;
    fVar236 = auVar113._16_4_;
    fVar237 = auVar113._20_4_;
    fVar238 = auVar113._24_4_;
    auVar131._4_4_ = fVar265 * fVar265 * fVar265 * auVar118._4_4_;
    auVar131._0_4_ = fVar260 * fVar260 * fVar260 * auVar118._0_4_;
    auVar131._8_4_ = fVar266 * fVar266 * fVar266 * auVar118._8_4_;
    auVar131._12_4_ = fVar267 * fVar267 * fVar267 * auVar118._12_4_;
    auVar131._16_4_ = fVar236 * fVar236 * fVar236 * auVar118._16_4_;
    auVar131._20_4_ = fVar237 * fVar237 * fVar237 * auVar118._20_4_;
    auVar131._24_4_ = fVar238 * fVar238 * fVar238 * auVar118._24_4_;
    auVar131._28_4_ = auVar128._28_4_;
    auVar127._8_4_ = 0x3fc00000;
    auVar127._0_8_ = 0x3fc000003fc00000;
    auVar127._12_4_ = 0x3fc00000;
    auVar127._16_4_ = 0x3fc00000;
    auVar127._20_4_ = 0x3fc00000;
    auVar127._24_4_ = 0x3fc00000;
    auVar127._28_4_ = 0x3fc00000;
    auVar113 = vfmadd231ps_avx512vl(auVar131,auVar113,auVar127);
    auVar118 = vmulps_avx512vl(auVar108,auVar113);
    auVar125 = vmulps_avx512vl(auVar111,auVar113);
    auVar126 = vmulps_avx512vl(auVar112,auVar113);
    auVar127 = vsubps_avx512vl(auVar293,auVar114);
    auVar128 = vsubps_avx512vl(auVar293,auVar115);
    auVar129 = vsubps_avx512vl(auVar293,auVar116);
    auVar130 = vmulps_avx512vl(local_5e0,auVar129);
    auVar130 = vfmadd231ps_avx512vl(auVar130,local_480,auVar128);
    auVar130 = vfmadd231ps_avx512vl(auVar130,local_5c0,auVar127);
    auVar131 = vmulps_avx512vl(auVar129,auVar129);
    auVar131 = vfmadd231ps_avx512vl(auVar131,auVar128,auVar128);
    auVar131 = vfmadd231ps_avx512vl(auVar131,auVar127,auVar127);
    auVar132 = vmulps_avx512vl(local_5e0,auVar126);
    auVar132 = vfmadd231ps_avx512vl(auVar132,auVar125,local_480);
    auVar132 = vfmadd231ps_avx512vl(auVar132,auVar118,local_5c0);
    auVar126 = vmulps_avx512vl(auVar129,auVar126);
    auVar125 = vfmadd231ps_avx512vl(auVar126,auVar128,auVar125);
    auVar118 = vfmadd231ps_avx512vl(auVar125,auVar127,auVar118);
    auVar125 = vmulps_avx512vl(auVar132,auVar132);
    auVar126 = vsubps_avx512vl(local_220,auVar125);
    auVar133 = vmulps_avx512vl(auVar132,auVar118);
    auVar130 = vsubps_avx512vl(auVar130,auVar133);
    auVar130 = vaddps_avx512vl(auVar130,auVar130);
    auVar133 = vmulps_avx512vl(auVar118,auVar118);
    local_820 = vsubps_avx512vl(auVar131,auVar133);
    auVar107 = vsubps_avx512vl(local_820,auVar107);
    local_740 = vmulps_avx512vl(auVar130,auVar130);
    _local_880 = vmulps_avx512vl(auVar126,auVar109);
    auVar131 = vmulps_avx512vl(_local_880,auVar107);
    auVar131 = vsubps_avx512vl(local_740,auVar131);
    auVar91 = vxorps_avx512vl(auVar109._0_16_,auVar109._0_16_);
    uVar70 = vcmpps_avx512vl(auVar131,auVar293,5);
    bVar60 = (byte)uVar70;
    if (bVar60 == 0) {
LAB_018d5b86:
      auVar251 = ZEXT3264(_DAT_01f7b040);
      auVar110 = vmovdqa64_avx512vl(auVar96);
      auVar291 = ZEXT3264(auVar110);
      auVar110 = vmovdqa64_avx512vl(auVar97);
      auVar292 = ZEXT3264(auVar110);
    }
    else {
      auVar131 = vsqrtps_avx512vl(auVar131);
      local_8a0 = vaddps_avx512vl(auVar126,auVar126);
      _local_620 = vrcp14ps_avx512vl(local_8a0);
      auVar109._8_4_ = 0x3f800000;
      auVar109._0_8_ = 0x3f8000003f800000;
      auVar109._12_4_ = 0x3f800000;
      auVar109._16_4_ = 0x3f800000;
      auVar109._20_4_ = 0x3f800000;
      auVar109._24_4_ = 0x3f800000;
      auVar109._28_4_ = 0x3f800000;
      auVar109 = vfnmadd213ps_avx512vl(_local_620,local_8a0,auVar109);
      auVar109 = vfmadd132ps_avx512vl(auVar109,_local_620,_local_620);
      local_640 = vxorps_avx512vl(auVar130,auVar117);
      auVar117 = vsubps_avx512vl(local_640,auVar131);
      local_600 = vmulps_avx512vl(auVar117,auVar109);
      auVar117 = vsubps_avx512vl(auVar131,auVar130);
      local_660 = vmulps_avx512vl(auVar117,auVar109);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar131 = vblendmps_avx512vl(auVar117,local_600);
      auVar134._0_4_ =
           (uint)(bVar60 & 1) * auVar131._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar117._0_4_;
      bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar134._4_4_ = (uint)bVar69 * auVar131._4_4_ | (uint)!bVar69 * auVar117._4_4_;
      bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar134._8_4_ = (uint)bVar69 * auVar131._8_4_ | (uint)!bVar69 * auVar117._8_4_;
      bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar134._12_4_ = (uint)bVar69 * auVar131._12_4_ | (uint)!bVar69 * auVar117._12_4_;
      bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar134._16_4_ = (uint)bVar69 * auVar131._16_4_ | (uint)!bVar69 * auVar117._16_4_;
      bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar134._20_4_ = (uint)bVar69 * auVar131._20_4_ | (uint)!bVar69 * auVar117._20_4_;
      bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar134._24_4_ = (uint)bVar69 * auVar131._24_4_ | (uint)!bVar69 * auVar117._24_4_;
      bVar69 = SUB81(uVar70 >> 7,0);
      auVar134._28_4_ = (uint)bVar69 * auVar131._28_4_ | (uint)!bVar69 * auVar117._28_4_;
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar131 = vblendmps_avx512vl(auVar117,local_660);
      auVar135._0_4_ =
           (uint)(bVar60 & 1) * auVar131._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar117._0_4_;
      bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar135._4_4_ = (uint)bVar69 * auVar131._4_4_ | (uint)!bVar69 * auVar117._4_4_;
      bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar135._8_4_ = (uint)bVar69 * auVar131._8_4_ | (uint)!bVar69 * auVar117._8_4_;
      bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar135._12_4_ = (uint)bVar69 * auVar131._12_4_ | (uint)!bVar69 * auVar117._12_4_;
      bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar135._16_4_ = (uint)bVar69 * auVar131._16_4_ | (uint)!bVar69 * auVar117._16_4_;
      bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar135._20_4_ = (uint)bVar69 * auVar131._20_4_ | (uint)!bVar69 * auVar117._20_4_;
      bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar135._24_4_ = (uint)bVar69 * auVar131._24_4_ | (uint)!bVar69 * auVar117._24_4_;
      bVar69 = SUB81(uVar70 >> 7,0);
      auVar135._28_4_ = (uint)bVar69 * auVar131._28_4_ | (uint)!bVar69 * auVar117._28_4_;
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar125,auVar117);
      local_680 = vmaxps_avx512vl(local_240,auVar117);
      auVar293._8_4_ = 0x36000000;
      auVar293._0_8_ = 0x3600000036000000;
      auVar293._12_4_ = 0x36000000;
      auVar293._16_4_ = 0x36000000;
      auVar293._20_4_ = 0x36000000;
      auVar293._24_4_ = 0x36000000;
      auVar293._28_4_ = 0x36000000;
      local_760 = vmulps_avx512vl(local_680,auVar293);
      vandps_avx512vl(auVar126,auVar117);
      uVar22 = vcmpps_avx512vl(local_760,local_760,1);
      uVar70 = uVar70 & uVar22;
      bVar66 = (byte)uVar70;
      if (bVar66 != 0) {
        uVar22 = vcmpps_avx512vl(auVar107,ZEXT1632(auVar91),2);
        auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar125 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar126 = vblendmps_avx512vl(auVar107,auVar125);
        bVar65 = (byte)uVar22;
        uVar71 = (uint)(bVar65 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar65 & 1) * local_760._0_4_;
        bVar69 = (bool)((byte)(uVar22 >> 1) & 1);
        uVar148 = (uint)bVar69 * auVar126._4_4_ | (uint)!bVar69 * local_760._4_4_;
        bVar69 = (bool)((byte)(uVar22 >> 2) & 1);
        uVar149 = (uint)bVar69 * auVar126._8_4_ | (uint)!bVar69 * local_760._8_4_;
        bVar69 = (bool)((byte)(uVar22 >> 3) & 1);
        uVar150 = (uint)bVar69 * auVar126._12_4_ | (uint)!bVar69 * local_760._12_4_;
        bVar69 = (bool)((byte)(uVar22 >> 4) & 1);
        uVar151 = (uint)bVar69 * auVar126._16_4_ | (uint)!bVar69 * local_760._16_4_;
        bVar69 = (bool)((byte)(uVar22 >> 5) & 1);
        uVar152 = (uint)bVar69 * auVar126._20_4_ | (uint)!bVar69 * local_760._20_4_;
        bVar69 = (bool)((byte)(uVar22 >> 6) & 1);
        uVar153 = (uint)bVar69 * auVar126._24_4_ | (uint)!bVar69 * local_760._24_4_;
        bVar69 = SUB81(uVar22 >> 7,0);
        uVar154 = (uint)bVar69 * auVar126._28_4_ | (uint)!bVar69 * local_760._28_4_;
        auVar134._0_4_ = (bVar66 & 1) * uVar71 | !(bool)(bVar66 & 1) * auVar134._0_4_;
        bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar134._4_4_ = bVar69 * uVar148 | !bVar69 * auVar134._4_4_;
        bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar134._8_4_ = bVar69 * uVar149 | !bVar69 * auVar134._8_4_;
        bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar134._12_4_ = bVar69 * uVar150 | !bVar69 * auVar134._12_4_;
        bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar134._16_4_ = bVar69 * uVar151 | !bVar69 * auVar134._16_4_;
        bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar134._20_4_ = bVar69 * uVar152 | !bVar69 * auVar134._20_4_;
        bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar134._24_4_ = bVar69 * uVar153 | !bVar69 * auVar134._24_4_;
        bVar69 = SUB81(uVar70 >> 7,0);
        auVar134._28_4_ = bVar69 * uVar154 | !bVar69 * auVar134._28_4_;
        auVar107 = vblendmps_avx512vl(auVar125,auVar107);
        bVar69 = (bool)((byte)(uVar22 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar22 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar22 >> 3) & 1);
        bVar15 = (bool)((byte)(uVar22 >> 4) & 1);
        bVar16 = (bool)((byte)(uVar22 >> 5) & 1);
        bVar17 = (bool)((byte)(uVar22 >> 6) & 1);
        bVar18 = SUB81(uVar22 >> 7,0);
        auVar135._0_4_ =
             (uint)(bVar66 & 1) *
             ((uint)(bVar65 & 1) * auVar107._0_4_ | !(bool)(bVar65 & 1) * uVar71) |
             !(bool)(bVar66 & 1) * auVar135._0_4_;
        bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar135._4_4_ =
             (uint)bVar12 * ((uint)bVar69 * auVar107._4_4_ | !bVar69 * uVar148) |
             !bVar12 * auVar135._4_4_;
        bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar135._8_4_ =
             (uint)bVar69 * ((uint)bVar13 * auVar107._8_4_ | !bVar13 * uVar149) |
             !bVar69 * auVar135._8_4_;
        bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar135._12_4_ =
             (uint)bVar69 * ((uint)bVar14 * auVar107._12_4_ | !bVar14 * uVar150) |
             !bVar69 * auVar135._12_4_;
        bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar135._16_4_ =
             (uint)bVar69 * ((uint)bVar15 * auVar107._16_4_ | !bVar15 * uVar151) |
             !bVar69 * auVar135._16_4_;
        bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar135._20_4_ =
             (uint)bVar69 * ((uint)bVar16 * auVar107._20_4_ | !bVar16 * uVar152) |
             !bVar69 * auVar135._20_4_;
        bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar135._24_4_ =
             (uint)bVar69 * ((uint)bVar17 * auVar107._24_4_ | !bVar17 * uVar153) |
             !bVar69 * auVar135._24_4_;
        bVar69 = SUB81(uVar70 >> 7,0);
        auVar135._28_4_ =
             (uint)bVar69 * ((uint)bVar18 * auVar107._28_4_ | !bVar18 * uVar154) |
             !bVar69 * auVar135._28_4_;
        bVar60 = (~bVar66 | bVar65) & bVar60;
      }
      if ((bVar60 & 0x7f) == 0) {
        auVar251 = ZEXT3264(_DAT_01f7b040);
        auVar110 = vmovdqa64_avx512vl(auVar96);
        auVar291 = ZEXT3264(auVar110);
        auVar110 = vmovdqa64_avx512vl(auVar97);
        auVar292 = ZEXT3264(auVar110);
      }
      else {
        auVar107 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar125 = vxorps_avx512vl(auVar124,auVar107);
        auVar126 = vxorps_avx512vl(auVar122,auVar107);
        auVar251 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
        auVar117 = vxorps_avx512vl(auVar123,auVar107);
        auVar91 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                                 ZEXT416((uint)local_6f0._0_4_));
        auVar122 = vbroadcastss_avx512vl(auVar91);
        auVar122 = vminps_avx512vl(auVar122,auVar135);
        auVar59._4_4_ = fStack_2dc;
        auVar59._0_4_ = local_2e0;
        auVar59._8_4_ = fStack_2d8;
        auVar59._12_4_ = fStack_2d4;
        auVar59._16_4_ = fStack_2d0;
        auVar59._20_4_ = fStack_2cc;
        auVar59._24_4_ = fStack_2c8;
        auVar59._28_4_ = fStack_2c4;
        auVar123 = vmaxps_avx512vl(auVar59,auVar134);
        auVar124 = vmulps_avx512vl(auVar138,auVar129);
        auVar124 = vfmadd213ps_avx512vl(auVar128,auVar137,auVar124);
        auVar91 = vfmadd213ps_fma(auVar127,auVar136,auVar124);
        auVar127 = vmulps_avx512vl(local_5e0,auVar138);
        auVar127 = vfmadd231ps_avx512vl(auVar127,local_480,auVar137);
        auVar127 = vfmadd231ps_avx512vl(auVar127,local_5c0,auVar136);
        auVar124 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar127,auVar124);
        auVar128 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar21 = vcmpps_avx512vl(auVar124,auVar128,1);
        auVar129 = vxorps_avx512vl(ZEXT1632(auVar91),auVar107);
        auVar136 = vrcp14ps_avx512vl(auVar127);
        auVar137 = vxorps_avx512vl(auVar127,auVar107);
        auVar138 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar131 = vfnmadd213ps_avx512vl(auVar136,auVar127,auVar138);
        auVar91 = vfmadd132ps_fma(auVar131,auVar136,auVar136);
        fVar260 = auVar91._0_4_ * auVar129._0_4_;
        fVar265 = auVar91._4_4_ * auVar129._4_4_;
        auVar37._4_4_ = fVar265;
        auVar37._0_4_ = fVar260;
        fVar266 = auVar91._8_4_ * auVar129._8_4_;
        auVar37._8_4_ = fVar266;
        fVar267 = auVar91._12_4_ * auVar129._12_4_;
        auVar37._12_4_ = fVar267;
        fVar236 = auVar129._16_4_ * 0.0;
        auVar37._16_4_ = fVar236;
        fVar237 = auVar129._20_4_ * 0.0;
        auVar37._20_4_ = fVar237;
        fVar238 = auVar129._24_4_ * 0.0;
        auVar37._24_4_ = fVar238;
        auVar37._28_4_ = auVar129._28_4_;
        uVar24 = vcmpps_avx512vl(auVar127,auVar137,1);
        bVar66 = (byte)uVar21 | (byte)uVar24;
        auVar131 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar109 = vblendmps_avx512vl(auVar37,auVar131);
        auVar139._0_4_ =
             (uint)(bVar66 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar136._0_4_;
        bVar69 = (bool)(bVar66 >> 1 & 1);
        auVar139._4_4_ = (uint)bVar69 * auVar109._4_4_ | (uint)!bVar69 * auVar136._4_4_;
        bVar69 = (bool)(bVar66 >> 2 & 1);
        auVar139._8_4_ = (uint)bVar69 * auVar109._8_4_ | (uint)!bVar69 * auVar136._8_4_;
        bVar69 = (bool)(bVar66 >> 3 & 1);
        auVar139._12_4_ = (uint)bVar69 * auVar109._12_4_ | (uint)!bVar69 * auVar136._12_4_;
        bVar69 = (bool)(bVar66 >> 4 & 1);
        auVar139._16_4_ = (uint)bVar69 * auVar109._16_4_ | (uint)!bVar69 * auVar136._16_4_;
        bVar69 = (bool)(bVar66 >> 5 & 1);
        auVar139._20_4_ = (uint)bVar69 * auVar109._20_4_ | (uint)!bVar69 * auVar136._20_4_;
        bVar69 = (bool)(bVar66 >> 6 & 1);
        auVar139._24_4_ = (uint)bVar69 * auVar109._24_4_ | (uint)!bVar69 * auVar136._24_4_;
        auVar139._28_4_ =
             (uint)(bVar66 >> 7) * auVar109._28_4_ | (uint)!(bool)(bVar66 >> 7) * auVar136._28_4_;
        auVar136 = vmaxps_avx512vl(auVar123,auVar139);
        auVar283 = ZEXT3264(auVar136);
        uVar24 = vcmpps_avx512vl(auVar127,auVar137,6);
        bVar66 = (byte)uVar21 | (byte)uVar24;
        auVar140._0_4_ = (uint)(bVar66 & 1) * 0x7f800000 | (uint)!(bool)(bVar66 & 1) * (int)fVar260;
        bVar69 = (bool)(bVar66 >> 1 & 1);
        auVar140._4_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar265;
        bVar69 = (bool)(bVar66 >> 2 & 1);
        auVar140._8_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar266;
        bVar69 = (bool)(bVar66 >> 3 & 1);
        auVar140._12_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar267;
        bVar69 = (bool)(bVar66 >> 4 & 1);
        auVar140._16_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar236;
        bVar69 = (bool)(bVar66 >> 5 & 1);
        auVar140._20_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar237;
        bVar69 = (bool)(bVar66 >> 6 & 1);
        auVar140._24_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar238;
        auVar140._28_4_ =
             (uint)(bVar66 >> 7) * 0x7f800000 | (uint)!(bool)(bVar66 >> 7) * auVar129._28_4_;
        auVar127 = vminps_avx512vl(auVar122,auVar140);
        auVar91 = vxorps_avx512vl(auVar123._0_16_,auVar123._0_16_);
        auVar119 = vsubps_avx512vl(ZEXT1632(auVar91),auVar119);
        auVar120 = vsubps_avx512vl(ZEXT1632(auVar91),auVar120);
        auVar122 = ZEXT1632(auVar91);
        auVar121 = vsubps_avx512vl(auVar122,auVar121);
        auVar121 = vmulps_avx512vl(auVar121,auVar125);
        auVar120 = vfmadd231ps_avx512vl(auVar121,auVar117,auVar120);
        auVar119 = vfmadd231ps_avx512vl(auVar120,auVar126,auVar119);
        auVar125 = vmulps_avx512vl(local_5e0,auVar125);
        auVar125 = vfmadd231ps_avx512vl(auVar125,local_480,auVar117);
        auVar125 = vfmadd231ps_avx512vl(auVar125,local_5c0,auVar126);
        vandps_avx512vl(auVar125,auVar124);
        uVar21 = vcmpps_avx512vl(auVar125,auVar128,1);
        auVar126 = vxorps_avx512vl(auVar119,auVar107);
        auVar117 = vrcp14ps_avx512vl(auVar125);
        auVar107 = vxorps_avx512vl(auVar125,auVar107);
        auVar278 = ZEXT3264(auVar107);
        auVar119 = vfnmadd213ps_avx512vl(auVar117,auVar125,auVar138);
        auVar91 = vfmadd132ps_fma(auVar119,auVar117,auVar117);
        fVar260 = auVar91._0_4_ * auVar126._0_4_;
        fVar265 = auVar91._4_4_ * auVar126._4_4_;
        auVar38._4_4_ = fVar265;
        auVar38._0_4_ = fVar260;
        fVar266 = auVar91._8_4_ * auVar126._8_4_;
        auVar38._8_4_ = fVar266;
        fVar267 = auVar91._12_4_ * auVar126._12_4_;
        auVar38._12_4_ = fVar267;
        fVar236 = auVar126._16_4_ * 0.0;
        auVar38._16_4_ = fVar236;
        fVar237 = auVar126._20_4_ * 0.0;
        auVar38._20_4_ = fVar237;
        fVar238 = auVar126._24_4_ * 0.0;
        auVar38._24_4_ = fVar238;
        auVar38._28_4_ = auVar126._28_4_;
        uVar24 = vcmpps_avx512vl(auVar125,auVar107,1);
        bVar66 = (byte)uVar21 | (byte)uVar24;
        auVar119 = vblendmps_avx512vl(auVar38,auVar131);
        auVar141._0_4_ =
             (uint)(bVar66 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar117._0_4_;
        bVar69 = (bool)(bVar66 >> 1 & 1);
        auVar141._4_4_ = (uint)bVar69 * auVar119._4_4_ | (uint)!bVar69 * auVar117._4_4_;
        bVar69 = (bool)(bVar66 >> 2 & 1);
        auVar141._8_4_ = (uint)bVar69 * auVar119._8_4_ | (uint)!bVar69 * auVar117._8_4_;
        bVar69 = (bool)(bVar66 >> 3 & 1);
        auVar141._12_4_ = (uint)bVar69 * auVar119._12_4_ | (uint)!bVar69 * auVar117._12_4_;
        bVar69 = (bool)(bVar66 >> 4 & 1);
        auVar141._16_4_ = (uint)bVar69 * auVar119._16_4_ | (uint)!bVar69 * auVar117._16_4_;
        bVar69 = (bool)(bVar66 >> 5 & 1);
        auVar141._20_4_ = (uint)bVar69 * auVar119._20_4_ | (uint)!bVar69 * auVar117._20_4_;
        bVar69 = (bool)(bVar66 >> 6 & 1);
        auVar141._24_4_ = (uint)bVar69 * auVar119._24_4_ | (uint)!bVar69 * auVar117._24_4_;
        auVar141._28_4_ =
             (uint)(bVar66 >> 7) * auVar119._28_4_ | (uint)!(bool)(bVar66 >> 7) * auVar117._28_4_;
        local_5a0 = vmaxps_avx(auVar136,auVar141);
        auVar274 = ZEXT3264(local_5a0);
        uVar24 = vcmpps_avx512vl(auVar125,auVar107,6);
        bVar66 = (byte)uVar21 | (byte)uVar24;
        auVar142._0_4_ = (uint)(bVar66 & 1) * 0x7f800000 | (uint)!(bool)(bVar66 & 1) * (int)fVar260;
        bVar69 = (bool)(bVar66 >> 1 & 1);
        auVar142._4_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar265;
        bVar69 = (bool)(bVar66 >> 2 & 1);
        auVar142._8_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar266;
        bVar69 = (bool)(bVar66 >> 3 & 1);
        auVar142._12_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar267;
        bVar69 = (bool)(bVar66 >> 4 & 1);
        auVar142._16_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar236;
        bVar69 = (bool)(bVar66 >> 5 & 1);
        auVar142._20_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar237;
        bVar69 = (bool)(bVar66 >> 6 & 1);
        auVar142._24_4_ = (uint)bVar69 * 0x7f800000 | (uint)!bVar69 * (int)fVar238;
        auVar142._28_4_ =
             (uint)(bVar66 >> 7) * 0x7f800000 | (uint)!(bool)(bVar66 >> 7) * auVar126._28_4_;
        local_320 = vminps_avx(auVar127,auVar142);
        auVar271 = ZEXT3264(local_320);
        uVar21 = vcmpps_avx512vl(local_5a0,local_320,2);
        bVar60 = bVar60 & 0x7f & (byte)uVar21;
        if (bVar60 == 0) goto LAB_018d5b86;
        auVar107 = vmaxps_avx512vl(auVar122,auVar110);
        auVar110 = vfmadd213ps_avx512vl(local_600,auVar132,auVar118);
        fVar260 = auVar113._0_4_;
        fVar265 = auVar113._4_4_;
        auVar39._4_4_ = fVar265 * auVar110._4_4_;
        auVar39._0_4_ = fVar260 * auVar110._0_4_;
        fVar266 = auVar113._8_4_;
        auVar39._8_4_ = fVar266 * auVar110._8_4_;
        fVar267 = auVar113._12_4_;
        auVar39._12_4_ = fVar267 * auVar110._12_4_;
        fVar236 = auVar113._16_4_;
        auVar39._16_4_ = fVar236 * auVar110._16_4_;
        fVar237 = auVar113._20_4_;
        auVar39._20_4_ = fVar237 * auVar110._20_4_;
        fVar238 = auVar113._24_4_;
        auVar39._24_4_ = fVar238 * auVar110._24_4_;
        auVar39._28_4_ = auVar110._28_4_;
        auVar110 = vfmadd213ps_avx512vl(local_660,auVar132,auVar118);
        auVar40._4_4_ = fVar265 * auVar110._4_4_;
        auVar40._0_4_ = fVar260 * auVar110._0_4_;
        auVar40._8_4_ = fVar266 * auVar110._8_4_;
        auVar40._12_4_ = fVar267 * auVar110._12_4_;
        auVar40._16_4_ = fVar236 * auVar110._16_4_;
        auVar40._20_4_ = fVar237 * auVar110._20_4_;
        auVar40._24_4_ = fVar238 * auVar110._24_4_;
        auVar40._28_4_ = auVar110._28_4_;
        auVar110 = vminps_avx512vl(auVar39,auVar138);
        auVar47 = ZEXT812(0);
        auVar125 = ZEXT1232(auVar47) << 0x20;
        auVar110 = vmaxps_avx(auVar110,ZEXT1232(auVar47) << 0x20);
        auVar126 = vminps_avx512vl(auVar40,auVar138);
        auVar41._4_4_ = (auVar110._4_4_ + 1.0) * 0.125;
        auVar41._0_4_ = (auVar110._0_4_ + 0.0) * 0.125;
        auVar41._8_4_ = (auVar110._8_4_ + 2.0) * 0.125;
        auVar41._12_4_ = (auVar110._12_4_ + 3.0) * 0.125;
        auVar41._16_4_ = (auVar110._16_4_ + 4.0) * 0.125;
        auVar41._20_4_ = (auVar110._20_4_ + 5.0) * 0.125;
        auVar41._24_4_ = (auVar110._24_4_ + 6.0) * 0.125;
        auVar41._28_4_ = auVar110._28_4_ + 7.0;
        local_1a0 = vfmadd213ps_avx512vl(auVar41,auVar164,local_860);
        auVar110 = vmaxps_avx(auVar126,ZEXT1232(auVar47) << 0x20);
        auVar42._4_4_ = (auVar110._4_4_ + 1.0) * 0.125;
        auVar42._0_4_ = (auVar110._0_4_ + 0.0) * 0.125;
        auVar42._8_4_ = (auVar110._8_4_ + 2.0) * 0.125;
        auVar42._12_4_ = (auVar110._12_4_ + 3.0) * 0.125;
        auVar42._16_4_ = (auVar110._16_4_ + 4.0) * 0.125;
        auVar42._20_4_ = (auVar110._20_4_ + 5.0) * 0.125;
        auVar42._24_4_ = (auVar110._24_4_ + 6.0) * 0.125;
        auVar42._28_4_ = auVar110._28_4_ + 7.0;
        local_1c0 = vfmadd213ps_avx512vl(auVar42,auVar164,local_860);
        auVar43._4_4_ = auVar107._4_4_ * auVar107._4_4_;
        auVar43._0_4_ = auVar107._0_4_ * auVar107._0_4_;
        auVar43._8_4_ = auVar107._8_4_ * auVar107._8_4_;
        auVar43._12_4_ = auVar107._12_4_ * auVar107._12_4_;
        auVar43._16_4_ = auVar107._16_4_ * auVar107._16_4_;
        auVar43._20_4_ = auVar107._20_4_ * auVar107._20_4_;
        auVar43._24_4_ = auVar107._24_4_ * auVar107._24_4_;
        auVar43._28_4_ = auVar107._28_4_;
        auVar110 = vsubps_avx(local_820,auVar43);
        auVar283 = ZEXT3264(auVar110);
        auVar44._4_4_ = auVar110._4_4_ * (float)local_880._4_4_;
        auVar44._0_4_ = auVar110._0_4_ * (float)local_880._0_4_;
        auVar44._8_4_ = auVar110._8_4_ * fStack_878;
        auVar44._12_4_ = auVar110._12_4_ * fStack_874;
        auVar44._16_4_ = auVar110._16_4_ * fStack_870;
        auVar44._20_4_ = auVar110._20_4_ * fStack_86c;
        auVar44._24_4_ = auVar110._24_4_ * fStack_868;
        auVar44._28_4_ = auVar107._28_4_;
        auVar107 = vsubps_avx(local_740,auVar44);
        uVar21 = vcmpps_avx512vl(auVar107,ZEXT1232(auVar47) << 0x20,5);
        bVar66 = (byte)uVar21;
        if (bVar66 == 0) {
          bVar66 = 0;
          auVar108 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar111 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar107 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar126 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar274 = ZEXT864(0) << 0x20;
          auVar143._8_4_ = 0x7f800000;
          auVar143._0_8_ = 0x7f8000007f800000;
          auVar143._12_4_ = 0x7f800000;
          auVar143._16_4_ = 0x7f800000;
          auVar143._20_4_ = 0x7f800000;
          auVar143._24_4_ = 0x7f800000;
          auVar143._28_4_ = 0x7f800000;
          auVar144._8_4_ = 0xff800000;
          auVar144._0_8_ = 0xff800000ff800000;
          auVar144._12_4_ = 0xff800000;
          auVar144._16_4_ = 0xff800000;
          auVar144._20_4_ = 0xff800000;
          auVar144._24_4_ = 0xff800000;
          auVar144._28_4_ = 0xff800000;
        }
        else {
          uVar70 = vcmpps_avx512vl(auVar107,auVar122,5);
          auVar107 = vsqrtps_avx(auVar107);
          auVar125 = vfnmadd213ps_avx512vl(local_8a0,_local_620,auVar138);
          auVar91 = vfmadd132ps_fma(auVar125,_local_620,_local_620);
          auVar125 = vsubps_avx(local_640,auVar107);
          auVar45._4_4_ = auVar91._4_4_ * auVar125._4_4_;
          auVar45._0_4_ = auVar91._0_4_ * auVar125._0_4_;
          auVar45._8_4_ = auVar91._8_4_ * auVar125._8_4_;
          auVar45._12_4_ = auVar91._12_4_ * auVar125._12_4_;
          auVar45._16_4_ = auVar125._16_4_ * 0.0;
          auVar45._20_4_ = auVar125._20_4_ * 0.0;
          auVar45._24_4_ = auVar125._24_4_ * 0.0;
          auVar45._28_4_ = 0x3e000000;
          auVar107 = vsubps_avx512vl(auVar107,auVar130);
          auVar46._4_4_ = auVar91._4_4_ * auVar107._4_4_;
          auVar46._0_4_ = auVar91._0_4_ * auVar107._0_4_;
          auVar46._8_4_ = auVar91._8_4_ * auVar107._8_4_;
          auVar46._12_4_ = auVar91._12_4_ * auVar107._12_4_;
          auVar46._16_4_ = auVar107._16_4_ * 0.0;
          auVar46._20_4_ = auVar107._20_4_ * 0.0;
          auVar46._24_4_ = auVar107._24_4_ * 0.0;
          auVar46._28_4_ = uVar179;
          auVar107 = vfmadd213ps_avx512vl(auVar132,auVar45,auVar118);
          auVar273._0_4_ = fVar260 * auVar107._0_4_;
          auVar273._4_4_ = fVar265 * auVar107._4_4_;
          auVar273._8_4_ = fVar266 * auVar107._8_4_;
          auVar273._12_4_ = fVar267 * auVar107._12_4_;
          auVar273._16_4_ = fVar236 * auVar107._16_4_;
          auVar273._20_4_ = fVar237 * auVar107._20_4_;
          auVar273._24_4_ = fVar238 * auVar107._24_4_;
          auVar273._28_4_ = 0;
          auVar107 = vmulps_avx512vl(local_5c0,auVar45);
          auVar125 = vmulps_avx512vl(local_480,auVar45);
          auVar127 = vmulps_avx512vl(local_5e0,auVar45);
          auVar126 = vfmadd213ps_avx512vl(auVar108,auVar273,auVar114);
          auVar107 = vsubps_avx512vl(auVar107,auVar126);
          auVar126 = vfmadd213ps_avx512vl(auVar111,auVar273,auVar115);
          auVar126 = vsubps_avx512vl(auVar125,auVar126);
          auVar91 = vfmadd213ps_fma(auVar273,auVar112,auVar116);
          auVar125 = vsubps_avx(auVar127,ZEXT1632(auVar91));
          auVar274 = ZEXT3264(auVar125);
          auVar118 = vfmadd213ps_avx512vl(auVar132,auVar46,auVar118);
          auVar113 = vmulps_avx512vl(auVar113,auVar118);
          auVar118 = vmulps_avx512vl(local_5c0,auVar46);
          auVar127 = vmulps_avx512vl(local_480,auVar46);
          auVar117 = vmulps_avx512vl(local_5e0,auVar46);
          auVar91 = vfmadd213ps_fma(auVar108,auVar113,auVar114);
          auVar125 = vsubps_avx(auVar118,ZEXT1632(auVar91));
          auVar91 = vfmadd213ps_fma(auVar111,auVar113,auVar115);
          auVar108 = vsubps_avx512vl(auVar127,ZEXT1632(auVar91));
          auVar91 = vfmadd213ps_fma(auVar112,auVar113,auVar116);
          auVar111 = vsubps_avx512vl(auVar117,ZEXT1632(auVar91));
          auVar165._8_4_ = 0x7f800000;
          auVar165._0_8_ = 0x7f8000007f800000;
          auVar165._12_4_ = 0x7f800000;
          auVar165._16_4_ = 0x7f800000;
          auVar165._20_4_ = 0x7f800000;
          auVar165._24_4_ = 0x7f800000;
          auVar165._28_4_ = 0x7f800000;
          auVar112 = vblendmps_avx512vl(auVar165,auVar45);
          bVar69 = (bool)((byte)uVar70 & 1);
          auVar143._0_4_ = (uint)bVar69 * auVar112._0_4_ | (uint)!bVar69 * auVar114._0_4_;
          bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar143._4_4_ = (uint)bVar69 * auVar112._4_4_ | (uint)!bVar69 * auVar114._4_4_;
          bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar143._8_4_ = (uint)bVar69 * auVar112._8_4_ | (uint)!bVar69 * auVar114._8_4_;
          bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar143._12_4_ = (uint)bVar69 * auVar112._12_4_ | (uint)!bVar69 * auVar114._12_4_;
          bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar143._16_4_ = (uint)bVar69 * auVar112._16_4_ | (uint)!bVar69 * auVar114._16_4_;
          bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar143._20_4_ = (uint)bVar69 * auVar112._20_4_ | (uint)!bVar69 * auVar114._20_4_;
          bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar143._24_4_ = (uint)bVar69 * auVar112._24_4_ | (uint)!bVar69 * auVar114._24_4_;
          bVar69 = SUB81(uVar70 >> 7,0);
          auVar143._28_4_ = (uint)bVar69 * auVar112._28_4_ | (uint)!bVar69 * auVar114._28_4_;
          auVar166._8_4_ = 0xff800000;
          auVar166._0_8_ = 0xff800000ff800000;
          auVar166._12_4_ = 0xff800000;
          auVar166._16_4_ = 0xff800000;
          auVar166._20_4_ = 0xff800000;
          auVar166._24_4_ = 0xff800000;
          auVar166._28_4_ = 0xff800000;
          auVar112 = vblendmps_avx512vl(auVar166,auVar46);
          bVar69 = (bool)((byte)uVar70 & 1);
          auVar144._0_4_ = (uint)bVar69 * auVar112._0_4_ | (uint)!bVar69 * -0x800000;
          bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar144._4_4_ = (uint)bVar69 * auVar112._4_4_ | (uint)!bVar69 * -0x800000;
          bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar144._8_4_ = (uint)bVar69 * auVar112._8_4_ | (uint)!bVar69 * -0x800000;
          bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar144._12_4_ = (uint)bVar69 * auVar112._12_4_ | (uint)!bVar69 * -0x800000;
          bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar144._16_4_ = (uint)bVar69 * auVar112._16_4_ | (uint)!bVar69 * -0x800000;
          bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar144._20_4_ = (uint)bVar69 * auVar112._20_4_ | (uint)!bVar69 * -0x800000;
          bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar144._24_4_ = (uint)bVar69 * auVar112._24_4_ | (uint)!bVar69 * -0x800000;
          bVar69 = SUB81(uVar70 >> 7,0);
          auVar144._28_4_ = (uint)bVar69 * auVar112._28_4_ | (uint)!bVar69 * -0x800000;
          auVar33._8_4_ = 0x36000000;
          auVar33._0_8_ = 0x3600000036000000;
          auVar33._12_4_ = 0x36000000;
          auVar33._16_4_ = 0x36000000;
          auVar33._20_4_ = 0x36000000;
          auVar33._24_4_ = 0x36000000;
          auVar33._28_4_ = 0x36000000;
          auVar112 = vmulps_avx512vl(local_680,auVar33);
          uVar22 = vcmpps_avx512vl(auVar112,local_760,0xe);
          uVar70 = uVar70 & uVar22;
          bVar65 = (byte)uVar70;
          if (bVar65 != 0) {
            uVar22 = vcmpps_avx512vl(auVar110,_DAT_01f7b000,2);
            auVar263._8_4_ = 0x7f800000;
            auVar263._0_8_ = 0x7f8000007f800000;
            auVar263._12_4_ = 0x7f800000;
            auVar263._16_4_ = 0x7f800000;
            auVar263._20_4_ = 0x7f800000;
            auVar263._24_4_ = 0x7f800000;
            auVar263._28_4_ = 0x7f800000;
            auVar282._8_4_ = 0xff800000;
            auVar282._0_8_ = 0xff800000ff800000;
            auVar282._12_4_ = 0xff800000;
            auVar282._16_4_ = 0xff800000;
            auVar282._20_4_ = 0xff800000;
            auVar282._24_4_ = 0xff800000;
            auVar282._28_4_ = 0xff800000;
            auVar283 = ZEXT3264(auVar282);
            auVar110 = vblendmps_avx512vl(auVar263,auVar282);
            bVar61 = (byte)uVar22;
            uVar71 = (uint)(bVar61 & 1) * auVar110._0_4_ |
                     (uint)!(bool)(bVar61 & 1) * auVar112._0_4_;
            bVar69 = (bool)((byte)(uVar22 >> 1) & 1);
            uVar148 = (uint)bVar69 * auVar110._4_4_ | (uint)!bVar69 * auVar112._4_4_;
            bVar69 = (bool)((byte)(uVar22 >> 2) & 1);
            uVar149 = (uint)bVar69 * auVar110._8_4_ | (uint)!bVar69 * auVar112._8_4_;
            bVar69 = (bool)((byte)(uVar22 >> 3) & 1);
            uVar150 = (uint)bVar69 * auVar110._12_4_ | (uint)!bVar69 * auVar112._12_4_;
            bVar69 = (bool)((byte)(uVar22 >> 4) & 1);
            uVar151 = (uint)bVar69 * auVar110._16_4_ | (uint)!bVar69 * auVar112._16_4_;
            bVar69 = (bool)((byte)(uVar22 >> 5) & 1);
            uVar152 = (uint)bVar69 * auVar110._20_4_ | (uint)!bVar69 * auVar112._20_4_;
            bVar69 = (bool)((byte)(uVar22 >> 6) & 1);
            uVar153 = (uint)bVar69 * auVar110._24_4_ | (uint)!bVar69 * auVar112._24_4_;
            bVar69 = SUB81(uVar22 >> 7,0);
            uVar154 = (uint)bVar69 * auVar110._28_4_ | (uint)!bVar69 * auVar112._28_4_;
            auVar143._0_4_ = (bVar65 & 1) * uVar71 | !(bool)(bVar65 & 1) * auVar143._0_4_;
            bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar143._4_4_ = bVar69 * uVar148 | !bVar69 * auVar143._4_4_;
            bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar143._8_4_ = bVar69 * uVar149 | !bVar69 * auVar143._8_4_;
            bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar143._12_4_ = bVar69 * uVar150 | !bVar69 * auVar143._12_4_;
            bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
            auVar143._16_4_ = bVar69 * uVar151 | !bVar69 * auVar143._16_4_;
            bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
            auVar143._20_4_ = bVar69 * uVar152 | !bVar69 * auVar143._20_4_;
            bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
            auVar143._24_4_ = bVar69 * uVar153 | !bVar69 * auVar143._24_4_;
            bVar69 = SUB81(uVar70 >> 7,0);
            auVar143._28_4_ = bVar69 * uVar154 | !bVar69 * auVar143._28_4_;
            auVar110 = vblendmps_avx512vl(auVar282,auVar263);
            bVar69 = (bool)((byte)(uVar22 >> 1) & 1);
            bVar13 = (bool)((byte)(uVar22 >> 2) & 1);
            bVar14 = (bool)((byte)(uVar22 >> 3) & 1);
            bVar15 = (bool)((byte)(uVar22 >> 4) & 1);
            bVar16 = (bool)((byte)(uVar22 >> 5) & 1);
            bVar17 = (bool)((byte)(uVar22 >> 6) & 1);
            bVar18 = SUB81(uVar22 >> 7,0);
            auVar144._0_4_ =
                 (uint)(bVar65 & 1) *
                 ((uint)(bVar61 & 1) * auVar110._0_4_ | !(bool)(bVar61 & 1) * uVar71) |
                 !(bool)(bVar65 & 1) * auVar144._0_4_;
            bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar144._4_4_ =
                 (uint)bVar12 * ((uint)bVar69 * auVar110._4_4_ | !bVar69 * uVar148) |
                 !bVar12 * auVar144._4_4_;
            bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar144._8_4_ =
                 (uint)bVar69 * ((uint)bVar13 * auVar110._8_4_ | !bVar13 * uVar149) |
                 !bVar69 * auVar144._8_4_;
            bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar144._12_4_ =
                 (uint)bVar69 * ((uint)bVar14 * auVar110._12_4_ | !bVar14 * uVar150) |
                 !bVar69 * auVar144._12_4_;
            bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
            auVar144._16_4_ =
                 (uint)bVar69 * ((uint)bVar15 * auVar110._16_4_ | !bVar15 * uVar151) |
                 !bVar69 * auVar144._16_4_;
            bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
            auVar144._20_4_ =
                 (uint)bVar69 * ((uint)bVar16 * auVar110._20_4_ | !bVar16 * uVar152) |
                 !bVar69 * auVar144._20_4_;
            bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
            auVar144._24_4_ =
                 (uint)bVar69 * ((uint)bVar17 * auVar110._24_4_ | !bVar17 * uVar153) |
                 !bVar69 * auVar144._24_4_;
            bVar69 = SUB81(uVar70 >> 7,0);
            auVar144._28_4_ =
                 (uint)bVar69 * ((uint)bVar18 * auVar110._28_4_ | !bVar18 * uVar154) |
                 !bVar69 * auVar144._28_4_;
            bVar66 = (~bVar65 | bVar61) & bVar66;
          }
        }
        auVar110 = vmovdqa64_avx512vl(auVar96);
        auVar291 = ZEXT3264(auVar110);
        auVar110 = vmovdqa64_avx512vl(auVar97);
        auVar292 = ZEXT3264(auVar110);
        auVar110 = vmulps_avx512vl(local_5e0,auVar111);
        auVar110 = vfmadd231ps_avx512vl(auVar110,local_480,auVar108);
        auVar264 = ZEXT3264(local_480);
        auVar110 = vfmadd231ps_avx512vl(auVar110,local_5c0,auVar125);
        auVar278 = ZEXT3264(local_5a0);
        _local_200 = local_5a0;
        local_1e0 = vminps_avx(local_320,auVar143);
        auVar258._8_4_ = 0x7fffffff;
        auVar258._0_8_ = 0x7fffffff7fffffff;
        auVar258._12_4_ = 0x7fffffff;
        auVar258._16_4_ = 0x7fffffff;
        auVar258._20_4_ = 0x7fffffff;
        auVar258._24_4_ = 0x7fffffff;
        auVar258._28_4_ = 0x7fffffff;
        auVar259 = ZEXT3264(auVar258);
        auVar110 = vandps_avx(auVar110,auVar258);
        _local_560 = vmaxps_avx(local_5a0,auVar144);
        _local_340 = _local_560;
        auVar254._8_4_ = 0x3e99999a;
        auVar254._0_8_ = 0x3e99999a3e99999a;
        auVar254._12_4_ = 0x3e99999a;
        auVar254._16_4_ = 0x3e99999a;
        auVar254._20_4_ = 0x3e99999a;
        auVar254._24_4_ = 0x3e99999a;
        auVar254._28_4_ = 0x3e99999a;
        uVar21 = vcmpps_avx512vl(auVar110,auVar254,1);
        uVar24 = vcmpps_avx512vl(local_5a0,local_1e0,2);
        bVar65 = (byte)uVar24 & bVar60;
        uVar23 = vcmpps_avx512vl(_local_560,local_320,2);
        if ((bVar60 & ((byte)uVar23 | (byte)uVar24)) != 0) {
          bVar61 = (byte)uVar21 | ~bVar66;
          auVar110 = vmulps_avx512vl(local_5e0,auVar274._0_32_);
          auVar91 = vfmadd213ps_fma(auVar126,local_480,auVar110);
          auVar110 = vfmadd213ps_avx512vl(auVar107,local_5c0,ZEXT1632(auVar91));
          auVar110 = vandps_avx(auVar110,auVar258);
          uVar21 = vcmpps_avx512vl(auVar110,auVar254,1);
          bVar66 = (byte)uVar21 | ~bVar66;
          auVar167._8_4_ = 2;
          auVar167._0_8_ = 0x200000002;
          auVar167._12_4_ = 2;
          auVar167._16_4_ = 2;
          auVar167._20_4_ = 2;
          auVar167._24_4_ = 2;
          auVar167._28_4_ = 2;
          auVar34._8_4_ = 3;
          auVar34._0_8_ = 0x300000003;
          auVar34._12_4_ = 3;
          auVar34._16_4_ = 3;
          auVar34._20_4_ = 3;
          auVar34._24_4_ = 3;
          auVar34._28_4_ = 3;
          auVar110 = vpblendmd_avx512vl(auVar167,auVar34);
          local_300._0_4_ = (uint)(bVar66 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar66 & 1) * 2;
          bVar69 = (bool)(bVar66 >> 1 & 1);
          local_300._4_4_ = (uint)bVar69 * auVar110._4_4_ | (uint)!bVar69 * 2;
          bVar69 = (bool)(bVar66 >> 2 & 1);
          local_300._8_4_ = (uint)bVar69 * auVar110._8_4_ | (uint)!bVar69 * 2;
          bVar69 = (bool)(bVar66 >> 3 & 1);
          local_300._12_4_ = (uint)bVar69 * auVar110._12_4_ | (uint)!bVar69 * 2;
          bVar69 = (bool)(bVar66 >> 4 & 1);
          local_300._16_4_ = (uint)bVar69 * auVar110._16_4_ | (uint)!bVar69 * 2;
          bVar69 = (bool)(bVar66 >> 5 & 1);
          local_300._20_4_ = (uint)bVar69 * auVar110._20_4_ | (uint)!bVar69 * 2;
          bVar69 = (bool)(bVar66 >> 6 & 1);
          local_300._24_4_ = (uint)bVar69 * auVar110._24_4_ | (uint)!bVar69 * 2;
          local_300._28_4_ = (uint)(bVar66 >> 7) * auVar110._28_4_ | (uint)!(bool)(bVar66 >> 7) * 2;
          local_4e0 = vpbroadcastd_avx512vl();
          uVar21 = vpcmpd_avx512vl(local_4e0,local_300,5);
          local_540 = local_5a0._0_4_ + (float)local_580._0_4_;
          fStack_53c = local_5a0._4_4_ + (float)local_580._4_4_;
          fStack_538 = local_5a0._8_4_ + fStack_578;
          fStack_534 = local_5a0._12_4_ + fStack_574;
          fStack_530 = local_5a0._16_4_ + fStack_570;
          fStack_52c = local_5a0._20_4_ + fStack_56c;
          fStack_528 = local_5a0._24_4_ + fStack_568;
          fStack_524 = local_5a0._28_4_ + fStack_564;
          for (bVar66 = (byte)uVar21 & bVar65; bVar66 != 0;
              bVar66 = ~('\x01' << ((byte)iVar25 & 0x1f)) & bVar66 & (byte)uVar21) {
            auVar168._8_4_ = 0x7f800000;
            auVar168._0_8_ = 0x7f8000007f800000;
            auVar168._12_4_ = 0x7f800000;
            auVar168._16_4_ = 0x7f800000;
            auVar168._20_4_ = 0x7f800000;
            auVar168._24_4_ = 0x7f800000;
            auVar168._28_4_ = 0x7f800000;
            auVar110 = vblendmps_avx512vl(auVar168,local_5a0);
            auVar145._0_4_ =
                 (uint)(bVar66 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar66 & 1) * 0x7f800000;
            bVar69 = (bool)(bVar66 >> 1 & 1);
            auVar145._4_4_ = (uint)bVar69 * auVar110._4_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar66 >> 2 & 1);
            auVar145._8_4_ = (uint)bVar69 * auVar110._8_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar66 >> 3 & 1);
            auVar145._12_4_ = (uint)bVar69 * auVar110._12_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar66 >> 4 & 1);
            auVar145._16_4_ = (uint)bVar69 * auVar110._16_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar66 >> 5 & 1);
            auVar145._20_4_ = (uint)bVar69 * auVar110._20_4_ | (uint)!bVar69 * 0x7f800000;
            auVar145._24_4_ =
                 (uint)(bVar66 >> 6) * auVar110._24_4_ | (uint)!(bool)(bVar66 >> 6) * 0x7f800000;
            auVar145._28_4_ = 0x7f800000;
            auVar110 = vshufps_avx(auVar145,auVar145,0xb1);
            auVar110 = vminps_avx(auVar145,auVar110);
            auVar107 = vshufpd_avx(auVar110,auVar110,5);
            auVar110 = vminps_avx(auVar110,auVar107);
            auVar107 = vpermpd_avx2(auVar110,0x4e);
            auVar110 = vminps_avx(auVar110,auVar107);
            uVar21 = vcmpps_avx512vl(auVar145,auVar110,0);
            bVar62 = (byte)uVar21 & bVar66;
            bVar63 = bVar66;
            if (bVar62 != 0) {
              bVar63 = bVar62;
            }
            iVar25 = 0;
            for (uVar71 = (uint)bVar63; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
              iVar25 = iVar25 + 1;
            }
            uVar71 = *(uint *)(local_200 + (uint)(iVar25 << 2));
            fVar260 = auVar89._0_4_;
            auVar91 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar25 << 2)));
            if ((float)local_800._0_4_ < 0.0) {
              local_860._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar25 << 2)));
              auVar264 = ZEXT1664(auVar264._0_16_);
              auVar274 = ZEXT1664(auVar274._0_16_);
              auVar278 = ZEXT1664(auVar278._0_16_);
              auVar283 = ZEXT1664(auVar283._0_16_);
              fVar260 = sqrtf((float)local_800._0_4_);
              auVar110 = vmovdqa64_avx512vl(auVar97);
              auVar292 = ZEXT3264(auVar110);
              auVar110 = vmovdqa64_avx512vl(auVar96);
              auVar291 = ZEXT3264(auVar110);
              auVar91 = local_860._0_16_;
            }
            auVar259 = ZEXT464(uVar71);
            auVar3 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar85 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar82 = vminps_avx(local_7a0._0_16_,local_7e0._0_16_);
            auVar81 = vminps_avx(auVar3,auVar82);
            auVar3 = vmaxps_avx(local_7a0._0_16_,local_7e0._0_16_);
            auVar82 = vmaxps_avx(auVar85,auVar3);
            auVar219._8_4_ = 0x7fffffff;
            auVar219._0_8_ = 0x7fffffff7fffffff;
            auVar219._12_4_ = 0x7fffffff;
            auVar85 = vandps_avx(auVar81,auVar219);
            auVar3 = vandps_avx(auVar82,auVar219);
            auVar85 = vmaxps_avx(auVar85,auVar3);
            auVar3 = vmovshdup_avx(auVar85);
            auVar3 = vmaxss_avx(auVar3,auVar85);
            auVar85 = vshufpd_avx(auVar85,auVar85,1);
            auVar85 = vmaxss_avx(auVar85,auVar3);
            fVar265 = auVar85._0_4_ * 1.9073486e-06;
            local_840._0_4_ = fVar260 * 1.9073486e-06;
            local_6e0 = vshufps_avx(auVar82,auVar82,0xff);
            auVar91 = vinsertps_avx(ZEXT416(uVar71),auVar91,0x10);
            auVar271 = ZEXT1664(auVar91);
            lVar67 = 5;
            do {
              do {
                bVar69 = lVar67 == 0;
                lVar67 = lVar67 + -1;
                if (bVar69) goto LAB_018d6771;
                uVar179 = auVar271._0_4_;
                auVar158._4_4_ = uVar179;
                auVar158._0_4_ = uVar179;
                auVar158._8_4_ = uVar179;
                auVar158._12_4_ = uVar179;
                auVar91 = vfmadd132ps_fma(auVar158,ZEXT816(0) << 0x40,local_7f0);
                local_740 = auVar271._0_32_;
                auVar85 = vmovshdup_avx(auVar271._0_16_);
                fVar236 = auVar85._0_4_;
                fVar289 = 1.0 - fVar236;
                fVar267 = fVar289 * fVar289 * fVar289;
                fVar260 = fVar236 * fVar236;
                fVar238 = fVar236 * fVar260;
                auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar267),
                                         ZEXT416((uint)fVar238));
                fVar266 = fVar236 * fVar289;
                auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * fVar266 * 6.0)),
                                          ZEXT416((uint)(fVar289 * fVar266)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar82 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar238),
                                          ZEXT416((uint)fVar267));
                auVar78 = vfmadd231ss_fma(ZEXT416((uint)(fVar289 * fVar266 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar236 * fVar266)));
                fVar267 = fVar267 * 0.16666667;
                fVar236 = (auVar3._0_4_ + auVar81._0_4_) * 0.16666667;
                fVar237 = (auVar82._0_4_ + auVar78._0_4_) * 0.16666667;
                fVar238 = fVar238 * 0.16666667;
                auVar200._0_4_ = fVar238 * (float)local_7e0._0_4_;
                auVar200._4_4_ = fVar238 * (float)local_7e0._4_4_;
                auVar200._8_4_ = fVar238 * fStack_7d8;
                auVar200._12_4_ = fVar238 * fStack_7d4;
                auVar240._4_4_ = fVar237;
                auVar240._0_4_ = fVar237;
                auVar240._8_4_ = fVar237;
                auVar240._12_4_ = fVar237;
                auVar3 = vfmadd132ps_fma(auVar240,auVar200,local_7a0._0_16_);
                auVar201._4_4_ = fVar236;
                auVar201._0_4_ = fVar236;
                auVar201._8_4_ = fVar236;
                auVar201._12_4_ = fVar236;
                auVar3 = vfmadd132ps_fma(auVar201,auVar3,local_7c0._0_16_);
                auVar182._4_4_ = fVar267;
                auVar182._0_4_ = fVar267;
                auVar182._8_4_ = fVar267;
                auVar182._12_4_ = fVar267;
                auVar3 = vfmadd132ps_fma(auVar182,auVar3,local_780._0_16_);
                local_600._0_16_ = auVar3;
                auVar3 = vsubps_avx(auVar91,auVar3);
                auVar91 = vdpps_avx(auVar3,auVar3,0x7f);
                local_820._0_16_ = auVar91;
                local_860._0_16_ = ZEXT416((uint)fVar289);
                if (auVar91._0_4_ < 0.0) {
                  local_880._0_4_ = fVar260;
                  local_8a0._0_4_ = fVar266;
                  auVar251._0_4_ = sqrtf(auVar91._0_4_);
                  auVar251._4_60_ = extraout_var;
                  auVar91 = auVar251._0_16_;
                  fVar266 = (float)local_8a0._0_4_;
                  auVar82 = local_860._0_16_;
                }
                else {
                  auVar91 = vsqrtss_avx(auVar91,auVar91);
                  local_880._0_4_ = fVar260;
                  auVar82 = ZEXT416((uint)fVar289);
                }
                local_620._4_4_ = auVar82._0_4_;
                local_620._0_4_ = local_620._4_4_;
                fStack_618 = (float)local_620._4_4_;
                fStack_614 = (float)local_620._4_4_;
                auVar81 = vfnmsub213ss_fma(auVar85,auVar85,ZEXT416((uint)(fVar266 * 4.0)));
                auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar266 * 4.0)),auVar82,auVar82);
                fVar260 = (float)local_620._4_4_ * -(float)local_620._4_4_ * 0.5;
                fVar266 = auVar81._0_4_ * 0.5;
                fVar267 = auVar82._0_4_ * 0.5;
                local_880._0_4_ = (float)local_880._0_4_ * 0.5;
                auVar220._0_4_ = (float)local_880._0_4_ * (float)local_7e0._0_4_;
                auVar220._4_4_ = (float)local_880._0_4_ * (float)local_7e0._4_4_;
                auVar220._8_4_ = (float)local_880._0_4_ * fStack_7d8;
                auVar220._12_4_ = (float)local_880._0_4_ * fStack_7d4;
                auVar183._4_4_ = fVar267;
                auVar183._0_4_ = fVar267;
                auVar183._8_4_ = fVar267;
                auVar183._12_4_ = fVar267;
                auVar82 = vfmadd132ps_fma(auVar183,auVar220,local_7a0._0_16_);
                auVar202._4_4_ = fVar266;
                auVar202._0_4_ = fVar266;
                auVar202._8_4_ = fVar266;
                auVar202._12_4_ = fVar266;
                auVar82 = vfmadd132ps_fma(auVar202,auVar82,local_7c0._0_16_);
                auVar280._4_4_ = fVar260;
                auVar280._0_4_ = fVar260;
                auVar280._8_4_ = fVar260;
                auVar280._12_4_ = fVar260;
                _local_880 = vfmadd132ps_fma(auVar280,auVar82,local_780._0_16_);
                local_640._0_16_ = vdpps_avx(_local_880,_local_880,0x7f);
                auVar48._12_4_ = 0;
                auVar48._0_12_ = ZEXT812(0);
                fVar260 = local_640._0_4_;
                local_760._0_16_ = vrsqrt14ss_avx512f(auVar48 << 0x20,ZEXT416((uint)fVar260));
                fVar266 = local_760._0_4_;
                local_660._0_16_ = vrcp14ss_avx512f(auVar48 << 0x20,ZEXT416((uint)fVar260));
                auVar82 = vfnmadd213ss_fma(local_660._0_16_,local_640._0_16_,ZEXT416(0x40000000));
                local_680._0_4_ = auVar82._0_4_;
                local_8a0._0_4_ = auVar91._0_4_;
                if (fVar260 < -fVar260) {
                  fVar267 = sqrtf(fVar260);
                  auVar91 = ZEXT416((uint)local_8a0._0_4_);
                  auVar82 = _local_880;
                }
                else {
                  auVar82 = vsqrtss_avx(local_640._0_16_,local_640._0_16_);
                  fVar267 = auVar82._0_4_;
                  auVar82 = _local_880;
                }
                fVar236 = local_760._0_4_;
                fVar260 = fVar266 * 1.5 + fVar260 * -0.5 * fVar236 * fVar236 * fVar236;
                local_760._0_4_ = auVar82._0_4_ * fVar260;
                local_760._4_4_ = auVar82._4_4_ * fVar260;
                local_760._8_4_ = auVar82._8_4_ * fVar260;
                local_760._12_4_ = auVar82._12_4_ * fVar260;
                auVar81 = vdpps_avx(auVar3,local_760._0_16_,0x7f);
                fVar237 = auVar91._0_4_;
                fVar266 = auVar81._0_4_;
                auVar159._0_4_ = fVar266 * fVar266;
                auVar159._4_4_ = auVar81._4_4_ * auVar81._4_4_;
                auVar159._8_4_ = auVar81._8_4_ * auVar81._8_4_;
                auVar159._12_4_ = auVar81._12_4_ * auVar81._12_4_;
                auVar78 = vsubps_avx(local_820._0_16_,auVar159);
                fVar236 = auVar78._0_4_;
                auVar184._4_12_ = ZEXT812(0) << 0x20;
                auVar184._0_4_ = fVar236;
                auVar79 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar184);
                auVar80 = vmulss_avx512f(auVar79,ZEXT416(0x3fc00000));
                auVar83 = vmulss_avx512f(auVar78,ZEXT416(0xbf000000));
                if (fVar236 < 0.0) {
                  local_6a0._0_4_ = fVar267;
                  local_6c0._0_4_ = auVar80._0_4_;
                  local_6d0._4_4_ = fVar260;
                  local_6d0._0_4_ = fVar260;
                  fStack_6c8 = fVar260;
                  fStack_6c4 = fVar260;
                  local_6b0 = auVar79;
                  fVar236 = sqrtf(fVar236);
                  auVar83 = ZEXT416(auVar83._0_4_);
                  auVar80 = ZEXT416((uint)local_6c0._0_4_);
                  auVar91 = ZEXT416((uint)local_8a0._0_4_);
                  auVar79 = local_6b0;
                  auVar82 = _local_880;
                  fVar260 = (float)local_6d0._0_4_;
                  fVar238 = (float)local_6d0._4_4_;
                  fVar289 = fStack_6c8;
                  fVar290 = fStack_6c4;
                  fVar267 = (float)local_6a0._0_4_;
                }
                else {
                  auVar78 = vsqrtss_avx(auVar78,auVar78);
                  fVar236 = auVar78._0_4_;
                  fVar238 = fVar260;
                  fVar289 = fVar260;
                  fVar290 = fVar260;
                }
                auVar283 = ZEXT1664(auVar82);
                auVar278 = ZEXT1664(local_820._0_16_);
                auVar274 = ZEXT1664(auVar3);
                auVar110 = vmovdqa64_avx512vl(auVar96);
                auVar291 = ZEXT3264(auVar110);
                auVar110 = vmovdqa64_avx512vl(auVar97);
                auVar292 = ZEXT3264(auVar110);
                auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_860._0_16_,auVar85);
                auVar84 = vfmadd213ss_fma(auVar85,SUB6416(ZEXT464(0xc0000000),0),local_860._0_16_);
                auVar94 = local_740._0_16_;
                auVar85 = vshufps_avx(auVar94,auVar94,0x55);
                auVar203._0_4_ = auVar85._0_4_ * (float)local_7e0._0_4_;
                auVar203._4_4_ = auVar85._4_4_ * (float)local_7e0._4_4_;
                auVar203._8_4_ = auVar85._8_4_ * fStack_7d8;
                auVar203._12_4_ = auVar85._12_4_ * fStack_7d4;
                auVar221._0_4_ = auVar84._0_4_;
                auVar221._4_4_ = auVar221._0_4_;
                auVar221._8_4_ = auVar221._0_4_;
                auVar221._12_4_ = auVar221._0_4_;
                auVar85 = vfmadd132ps_fma(auVar221,auVar203,local_7a0._0_16_);
                auVar185._0_4_ = auVar78._0_4_;
                auVar185._4_4_ = auVar185._0_4_;
                auVar185._8_4_ = auVar185._0_4_;
                auVar185._12_4_ = auVar185._0_4_;
                auVar85 = vfmadd132ps_fma(auVar185,auVar85,local_7c0._0_16_);
                auVar85 = vfmadd132ps_fma(_local_620,auVar85,local_780._0_16_);
                auVar186._0_4_ = auVar85._0_4_ * (float)local_640._0_4_;
                auVar186._4_4_ = auVar85._4_4_ * (float)local_640._0_4_;
                auVar186._8_4_ = auVar85._8_4_ * (float)local_640._0_4_;
                auVar186._12_4_ = auVar85._12_4_ * (float)local_640._0_4_;
                auVar85 = vdpps_avx(auVar82,auVar85,0x7f);
                fVar198 = auVar85._0_4_;
                auVar204._0_4_ = auVar82._0_4_ * fVar198;
                auVar204._4_4_ = auVar82._4_4_ * fVar198;
                auVar204._8_4_ = auVar82._8_4_ * fVar198;
                auVar204._12_4_ = auVar82._12_4_ * fVar198;
                auVar85 = vsubps_avx(auVar186,auVar204);
                fVar198 = (float)local_680._0_4_ * (float)local_660._0_4_;
                auVar84 = vmaxss_avx(ZEXT416((uint)fVar265),
                                     ZEXT416((uint)(local_740._0_4_ * (float)local_840._0_4_)));
                auVar26._8_4_ = 0x80000000;
                auVar26._0_8_ = 0x8000000080000000;
                auVar26._12_4_ = 0x80000000;
                auVar92 = vxorps_avx512vl(auVar82,auVar26);
                auVar205._0_4_ = fVar260 * auVar85._0_4_ * fVar198;
                auVar205._4_4_ = fVar238 * auVar85._4_4_ * fVar198;
                auVar205._8_4_ = fVar289 * auVar85._8_4_ * fVar198;
                auVar205._12_4_ = fVar290 * auVar85._12_4_ * fVar198;
                auVar85 = vdpps_avx(auVar92,local_760._0_16_,0x7f);
                auVar78 = vfmadd213ss_fma(auVar91,ZEXT416((uint)fVar265),auVar84);
                auVar91 = vdpps_avx(auVar3,auVar205,0x7f);
                auVar93 = vfmadd213ss_fma(ZEXT416((uint)(fVar237 + 1.0)),
                                          ZEXT416((uint)(fVar265 / fVar267)),auVar78);
                fVar260 = auVar85._0_4_ + auVar91._0_4_;
                auVar91 = vdpps_avx(local_7f0,local_760._0_16_,0x7f);
                auVar85 = vdpps_avx(auVar3,auVar92,0x7f);
                auVar78 = vmulss_avx512f(auVar83,auVar79);
                auVar83 = vaddss_avx512f(auVar80,ZEXT416((uint)(auVar78._0_4_ *
                                                               auVar79._0_4_ * auVar79._0_4_)));
                auVar78 = vdpps_avx(auVar3,local_7f0,0x7f);
                auVar80 = vfnmadd231ss_fma(auVar85,auVar81,ZEXT416((uint)fVar260));
                auVar78 = vfnmadd231ss_fma(auVar78,auVar81,auVar91);
                auVar85 = vpermilps_avx(local_600._0_16_,0xff);
                fVar236 = fVar236 - auVar85._0_4_;
                auVar79 = vshufps_avx(auVar82,auVar82,0xff);
                auVar85 = vfmsub213ss_fma(auVar80,auVar83,auVar79);
                auVar261._8_4_ = 0x80000000;
                auVar261._0_8_ = 0x8000000080000000;
                auVar261._12_4_ = 0x80000000;
                auVar264 = ZEXT1664(auVar261);
                auVar256._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
                auVar256._8_4_ = auVar85._8_4_ ^ 0x80000000;
                auVar256._12_4_ = auVar85._12_4_ ^ 0x80000000;
                auVar259 = ZEXT1664(auVar256);
                auVar78 = ZEXT416((uint)(auVar78._0_4_ * auVar83._0_4_));
                auVar80 = vfmsub231ss_fma(ZEXT416((uint)(auVar91._0_4_ * auVar85._0_4_)),
                                          ZEXT416((uint)fVar260),auVar78);
                auVar85 = vinsertps_avx(auVar256,auVar78,0x1c);
                auVar247._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
                auVar247._8_4_ = auVar91._8_4_ ^ 0x80000000;
                auVar247._12_4_ = auVar91._12_4_ ^ 0x80000000;
                auVar78 = vinsertps_avx(ZEXT416((uint)fVar260),auVar247,0x10);
                auVar222._0_4_ = auVar80._0_4_;
                auVar222._4_4_ = auVar222._0_4_;
                auVar222._8_4_ = auVar222._0_4_;
                auVar222._12_4_ = auVar222._0_4_;
                auVar91 = vdivps_avx(auVar85,auVar222);
                auVar85 = vdivps_avx(auVar78,auVar222);
                auVar223._0_4_ = fVar266 * auVar91._0_4_ + fVar236 * auVar85._0_4_;
                auVar223._4_4_ = fVar266 * auVar91._4_4_ + fVar236 * auVar85._4_4_;
                auVar223._8_4_ = fVar266 * auVar91._8_4_ + fVar236 * auVar85._8_4_;
                auVar223._12_4_ = fVar266 * auVar91._12_4_ + fVar236 * auVar85._12_4_;
                auVar91 = vsubps_avx(auVar94,auVar223);
                auVar271 = ZEXT1664(auVar91);
                auVar27._8_4_ = 0x7fffffff;
                auVar27._0_8_ = 0x7fffffff7fffffff;
                auVar27._12_4_ = 0x7fffffff;
                auVar85 = vandps_avx512vl(auVar81,auVar27);
              } while (auVar93._0_4_ <= auVar85._0_4_);
              auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar93._0_4_ + auVar84._0_4_)),local_6e0,
                                        ZEXT416(0x36000000));
              auVar28._8_4_ = 0x7fffffff;
              auVar28._0_8_ = 0x7fffffff7fffffff;
              auVar28._12_4_ = 0x7fffffff;
              auVar81 = vandps_avx512vl(ZEXT416((uint)fVar236),auVar28);
            } while (auVar85._0_4_ <= auVar81._0_4_);
            fVar260 = auVar91._0_4_ + (float)local_6f0._0_4_;
            if (fVar2 <= fVar260) {
              fVar265 = *(float *)(ray + k * 4 + 0x100);
              if (fVar260 <= fVar265) {
                auVar85 = vmovshdup_avx(auVar91);
                fVar266 = auVar85._0_4_;
                if ((0.0 <= fVar266) && (fVar266 <= 1.0)) {
                  auVar85 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_820._0_4_));
                  fVar267 = auVar85._0_4_;
                  pGVar6 = (context->scene->geometries).items[uVar4].ptr;
                  if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    fVar267 = fVar267 * 1.5 + local_820._0_4_ * -0.5 * fVar267 * fVar267 * fVar267;
                    auVar224._0_4_ = auVar3._0_4_ * fVar267;
                    auVar224._4_4_ = auVar3._4_4_ * fVar267;
                    auVar224._8_4_ = auVar3._8_4_ * fVar267;
                    auVar224._12_4_ = auVar3._12_4_ * fVar267;
                    auVar79 = vfmadd213ps_fma(auVar79,auVar224,auVar82);
                    auVar85 = vshufps_avx(auVar224,auVar224,0xc9);
                    auVar81 = vshufps_avx(auVar82,auVar82,0xc9);
                    auVar225._0_4_ = auVar224._0_4_ * auVar81._0_4_;
                    auVar225._4_4_ = auVar224._4_4_ * auVar81._4_4_;
                    auVar225._8_4_ = auVar224._8_4_ * auVar81._8_4_;
                    auVar225._12_4_ = auVar224._12_4_ * auVar81._12_4_;
                    auVar78 = vfmsub231ps_fma(auVar225,auVar82,auVar85);
                    auVar85 = vshufps_avx(auVar78,auVar78,0xc9);
                    auVar81 = vshufps_avx(auVar79,auVar79,0xc9);
                    auVar78 = vshufps_avx(auVar78,auVar78,0xd2);
                    auVar160._0_4_ = auVar79._0_4_ * auVar78._0_4_;
                    auVar160._4_4_ = auVar79._4_4_ * auVar78._4_4_;
                    auVar160._8_4_ = auVar79._8_4_ * auVar78._8_4_;
                    auVar160._12_4_ = auVar79._12_4_ * auVar78._12_4_;
                    auVar85 = vfmsub231ps_fma(auVar160,auVar85,auVar81);
                    uVar179 = auVar85._0_4_;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar260;
                      uVar5 = vextractps_avx(auVar85,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar5;
                      uVar5 = vextractps_avx(auVar85,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar5;
                      *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar179;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar266;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(int *)(ray + k * 4 + 0x220) = (int)local_828;
                      *(uint *)(ray + k * 4 + 0x240) = uVar4;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    }
                    else {
                      pRVar10 = context->user;
                      auVar233._8_4_ = 1;
                      auVar233._0_8_ = 0x100000001;
                      auVar233._12_4_ = 1;
                      auVar233._16_4_ = 1;
                      auVar233._20_4_ = 1;
                      auVar233._24_4_ = 1;
                      auVar233._28_4_ = 1;
                      local_400 = vpermps_avx2(auVar233,ZEXT1632(auVar91));
                      auVar110 = vpermps_avx2(auVar233,ZEXT1632(auVar85));
                      auVar242._8_4_ = 2;
                      auVar242._0_8_ = 0x200000002;
                      auVar242._12_4_ = 2;
                      auVar242._16_4_ = 2;
                      auVar242._20_4_ = 2;
                      auVar242._24_4_ = 2;
                      auVar242._28_4_ = 2;
                      local_440 = vpermps_avx2(auVar242,ZEXT1632(auVar85));
                      local_460[0] = (RTCHitN)auVar110[0];
                      local_460[1] = (RTCHitN)auVar110[1];
                      local_460[2] = (RTCHitN)auVar110[2];
                      local_460[3] = (RTCHitN)auVar110[3];
                      local_460[4] = (RTCHitN)auVar110[4];
                      local_460[5] = (RTCHitN)auVar110[5];
                      local_460[6] = (RTCHitN)auVar110[6];
                      local_460[7] = (RTCHitN)auVar110[7];
                      local_460[8] = (RTCHitN)auVar110[8];
                      local_460[9] = (RTCHitN)auVar110[9];
                      local_460[10] = (RTCHitN)auVar110[10];
                      local_460[0xb] = (RTCHitN)auVar110[0xb];
                      local_460[0xc] = (RTCHitN)auVar110[0xc];
                      local_460[0xd] = (RTCHitN)auVar110[0xd];
                      local_460[0xe] = (RTCHitN)auVar110[0xe];
                      local_460[0xf] = (RTCHitN)auVar110[0xf];
                      local_460[0x10] = (RTCHitN)auVar110[0x10];
                      local_460[0x11] = (RTCHitN)auVar110[0x11];
                      local_460[0x12] = (RTCHitN)auVar110[0x12];
                      local_460[0x13] = (RTCHitN)auVar110[0x13];
                      local_460[0x14] = (RTCHitN)auVar110[0x14];
                      local_460[0x15] = (RTCHitN)auVar110[0x15];
                      local_460[0x16] = (RTCHitN)auVar110[0x16];
                      local_460[0x17] = (RTCHitN)auVar110[0x17];
                      local_460[0x18] = (RTCHitN)auVar110[0x18];
                      local_460[0x19] = (RTCHitN)auVar110[0x19];
                      local_460[0x1a] = (RTCHitN)auVar110[0x1a];
                      local_460[0x1b] = (RTCHitN)auVar110[0x1b];
                      local_460[0x1c] = (RTCHitN)auVar110[0x1c];
                      local_460[0x1d] = (RTCHitN)auVar110[0x1d];
                      local_460[0x1e] = (RTCHitN)auVar110[0x1e];
                      local_460[0x1f] = (RTCHitN)auVar110[0x1f];
                      local_420 = uVar179;
                      uStack_41c = uVar179;
                      uStack_418 = uVar179;
                      uStack_414 = uVar179;
                      uStack_410 = uVar179;
                      uStack_40c = uVar179;
                      uStack_408 = uVar179;
                      uStack_404 = uVar179;
                      local_3e0 = ZEXT432(0) << 0x20;
                      local_3c0 = local_4c0._0_8_;
                      uStack_3b8 = local_4c0._8_8_;
                      uStack_3b0 = local_4c0._16_8_;
                      uStack_3a8 = local_4c0._24_8_;
                      local_3a0 = local_4a0;
                      auVar110 = vpcmpeqd_avx2(local_4a0,local_4a0);
                      local_830[1] = auVar110;
                      *local_830 = auVar110;
                      local_380 = pRVar10->instID[0];
                      uStack_37c = local_380;
                      uStack_378 = local_380;
                      uStack_374 = local_380;
                      uStack_370 = local_380;
                      uStack_36c = local_380;
                      uStack_368 = local_380;
                      uStack_364 = local_380;
                      local_360 = pRVar10->instPrimID[0];
                      uStack_35c = local_360;
                      uStack_358 = local_360;
                      uStack_354 = local_360;
                      uStack_350 = local_360;
                      uStack_34c = local_360;
                      uStack_348 = local_360;
                      uStack_344 = local_360;
                      *(float *)(ray + k * 4 + 0x100) = fVar260;
                      local_720 = local_500;
                      local_8d0.valid = (int *)local_720;
                      local_8d0.geometryUserPtr = pGVar6->userPtr;
                      local_8d0.context = context->user;
                      local_8d0.hit = local_460;
                      local_8d0.N = 8;
                      local_8d0.ray = (RTCRayN *)ray;
                      if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar259 = ZEXT1664(auVar256);
                        auVar264 = ZEXT1664(auVar261);
                        auVar271 = ZEXT1664(auVar91);
                        auVar274 = ZEXT1664(auVar3);
                        auVar278 = ZEXT1664(local_820._0_16_);
                        auVar283 = ZEXT1664(auVar82);
                        (*pGVar6->intersectionFilterN)(&local_8d0);
                        auVar110 = vmovdqa64_avx512vl(auVar97);
                        auVar292 = ZEXT3264(auVar110);
                        auVar110 = vmovdqa64_avx512vl(auVar96);
                        auVar291 = ZEXT3264(auVar110);
                      }
                      if (local_720 != (undefined1  [32])0x0) {
                        p_Var11 = context->args->filter;
                        if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar259 = ZEXT1664(auVar259._0_16_);
                          auVar264 = ZEXT1664(auVar264._0_16_);
                          auVar271 = ZEXT1664(auVar271._0_16_);
                          auVar274 = ZEXT1664(auVar274._0_16_);
                          auVar278 = ZEXT1664(auVar278._0_16_);
                          auVar283 = ZEXT1664(auVar283._0_16_);
                          (*p_Var11)(&local_8d0);
                          auVar110 = vmovdqa64_avx512vl(auVar97);
                          auVar292 = ZEXT3264(auVar110);
                          auVar110 = vmovdqa64_avx512vl(auVar96);
                          auVar291 = ZEXT3264(auVar110);
                        }
                        if (local_720 != (undefined1  [32])0x0) {
                          uVar70 = vptestmd_avx512vl(local_720,local_720);
                          iVar50 = *(int *)(local_8d0.hit + 4);
                          iVar51 = *(int *)(local_8d0.hit + 8);
                          iVar52 = *(int *)(local_8d0.hit + 0xc);
                          iVar53 = *(int *)(local_8d0.hit + 0x10);
                          iVar54 = *(int *)(local_8d0.hit + 0x14);
                          iVar55 = *(int *)(local_8d0.hit + 0x18);
                          iVar56 = *(int *)(local_8d0.hit + 0x1c);
                          bVar63 = (byte)uVar70;
                          bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
                          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
                          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
                          bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
                          bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
                          bVar16 = (bool)((byte)(uVar70 >> 6) & 1);
                          bVar17 = SUB81(uVar70 >> 7,0);
                          *(uint *)(local_8d0.ray + 0x180) =
                               (uint)(bVar63 & 1) * *(int *)local_8d0.hit |
                               (uint)!(bool)(bVar63 & 1) * *(int *)(local_8d0.ray + 0x180);
                          *(uint *)(local_8d0.ray + 0x184) =
                               (uint)bVar69 * iVar50 |
                               (uint)!bVar69 * *(int *)(local_8d0.ray + 0x184);
                          *(uint *)(local_8d0.ray + 0x188) =
                               (uint)bVar12 * iVar51 |
                               (uint)!bVar12 * *(int *)(local_8d0.ray + 0x188);
                          *(uint *)(local_8d0.ray + 0x18c) =
                               (uint)bVar13 * iVar52 |
                               (uint)!bVar13 * *(int *)(local_8d0.ray + 0x18c);
                          *(uint *)(local_8d0.ray + 400) =
                               (uint)bVar14 * iVar53 | (uint)!bVar14 * *(int *)(local_8d0.ray + 400)
                          ;
                          *(uint *)(local_8d0.ray + 0x194) =
                               (uint)bVar15 * iVar54 |
                               (uint)!bVar15 * *(int *)(local_8d0.ray + 0x194);
                          *(uint *)(local_8d0.ray + 0x198) =
                               (uint)bVar16 * iVar55 |
                               (uint)!bVar16 * *(int *)(local_8d0.ray + 0x198);
                          *(uint *)(local_8d0.ray + 0x19c) =
                               (uint)bVar17 * iVar56 |
                               (uint)!bVar17 * *(int *)(local_8d0.ray + 0x19c);
                          iVar50 = *(int *)(local_8d0.hit + 0x24);
                          iVar51 = *(int *)(local_8d0.hit + 0x28);
                          iVar52 = *(int *)(local_8d0.hit + 0x2c);
                          iVar53 = *(int *)(local_8d0.hit + 0x30);
                          iVar54 = *(int *)(local_8d0.hit + 0x34);
                          iVar55 = *(int *)(local_8d0.hit + 0x38);
                          iVar56 = *(int *)(local_8d0.hit + 0x3c);
                          bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
                          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
                          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
                          bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
                          bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
                          bVar16 = (bool)((byte)(uVar70 >> 6) & 1);
                          bVar17 = SUB81(uVar70 >> 7,0);
                          *(uint *)(local_8d0.ray + 0x1a0) =
                               (uint)(bVar63 & 1) * *(int *)(local_8d0.hit + 0x20) |
                               (uint)!(bool)(bVar63 & 1) * *(int *)(local_8d0.ray + 0x1a0);
                          *(uint *)(local_8d0.ray + 0x1a4) =
                               (uint)bVar69 * iVar50 |
                               (uint)!bVar69 * *(int *)(local_8d0.ray + 0x1a4);
                          *(uint *)(local_8d0.ray + 0x1a8) =
                               (uint)bVar12 * iVar51 |
                               (uint)!bVar12 * *(int *)(local_8d0.ray + 0x1a8);
                          *(uint *)(local_8d0.ray + 0x1ac) =
                               (uint)bVar13 * iVar52 |
                               (uint)!bVar13 * *(int *)(local_8d0.ray + 0x1ac);
                          *(uint *)(local_8d0.ray + 0x1b0) =
                               (uint)bVar14 * iVar53 |
                               (uint)!bVar14 * *(int *)(local_8d0.ray + 0x1b0);
                          *(uint *)(local_8d0.ray + 0x1b4) =
                               (uint)bVar15 * iVar54 |
                               (uint)!bVar15 * *(int *)(local_8d0.ray + 0x1b4);
                          *(uint *)(local_8d0.ray + 0x1b8) =
                               (uint)bVar16 * iVar55 |
                               (uint)!bVar16 * *(int *)(local_8d0.ray + 0x1b8);
                          *(uint *)(local_8d0.ray + 0x1bc) =
                               (uint)bVar17 * iVar56 |
                               (uint)!bVar17 * *(int *)(local_8d0.ray + 0x1bc);
                          iVar50 = *(int *)(local_8d0.hit + 0x44);
                          iVar51 = *(int *)(local_8d0.hit + 0x48);
                          iVar52 = *(int *)(local_8d0.hit + 0x4c);
                          iVar53 = *(int *)(local_8d0.hit + 0x50);
                          iVar54 = *(int *)(local_8d0.hit + 0x54);
                          iVar55 = *(int *)(local_8d0.hit + 0x58);
                          iVar56 = *(int *)(local_8d0.hit + 0x5c);
                          bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
                          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
                          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
                          bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
                          bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
                          bVar16 = (bool)((byte)(uVar70 >> 6) & 1);
                          bVar17 = SUB81(uVar70 >> 7,0);
                          *(uint *)(local_8d0.ray + 0x1c0) =
                               (uint)(bVar63 & 1) * *(int *)(local_8d0.hit + 0x40) |
                               (uint)!(bool)(bVar63 & 1) * *(int *)(local_8d0.ray + 0x1c0);
                          *(uint *)(local_8d0.ray + 0x1c4) =
                               (uint)bVar69 * iVar50 |
                               (uint)!bVar69 * *(int *)(local_8d0.ray + 0x1c4);
                          *(uint *)(local_8d0.ray + 0x1c8) =
                               (uint)bVar12 * iVar51 |
                               (uint)!bVar12 * *(int *)(local_8d0.ray + 0x1c8);
                          *(uint *)(local_8d0.ray + 0x1cc) =
                               (uint)bVar13 * iVar52 |
                               (uint)!bVar13 * *(int *)(local_8d0.ray + 0x1cc);
                          *(uint *)(local_8d0.ray + 0x1d0) =
                               (uint)bVar14 * iVar53 |
                               (uint)!bVar14 * *(int *)(local_8d0.ray + 0x1d0);
                          *(uint *)(local_8d0.ray + 0x1d4) =
                               (uint)bVar15 * iVar54 |
                               (uint)!bVar15 * *(int *)(local_8d0.ray + 0x1d4);
                          *(uint *)(local_8d0.ray + 0x1d8) =
                               (uint)bVar16 * iVar55 |
                               (uint)!bVar16 * *(int *)(local_8d0.ray + 0x1d8);
                          *(uint *)(local_8d0.ray + 0x1dc) =
                               (uint)bVar17 * iVar56 |
                               (uint)!bVar17 * *(int *)(local_8d0.ray + 0x1dc);
                          iVar50 = *(int *)(local_8d0.hit + 100);
                          iVar51 = *(int *)(local_8d0.hit + 0x68);
                          iVar52 = *(int *)(local_8d0.hit + 0x6c);
                          iVar53 = *(int *)(local_8d0.hit + 0x70);
                          iVar54 = *(int *)(local_8d0.hit + 0x74);
                          iVar55 = *(int *)(local_8d0.hit + 0x78);
                          iVar56 = *(int *)(local_8d0.hit + 0x7c);
                          bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
                          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
                          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
                          bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
                          bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
                          bVar16 = (bool)((byte)(uVar70 >> 6) & 1);
                          bVar17 = SUB81(uVar70 >> 7,0);
                          *(uint *)(local_8d0.ray + 0x1e0) =
                               (uint)(bVar63 & 1) * *(int *)(local_8d0.hit + 0x60) |
                               (uint)!(bool)(bVar63 & 1) * *(int *)(local_8d0.ray + 0x1e0);
                          *(uint *)(local_8d0.ray + 0x1e4) =
                               (uint)bVar69 * iVar50 |
                               (uint)!bVar69 * *(int *)(local_8d0.ray + 0x1e4);
                          *(uint *)(local_8d0.ray + 0x1e8) =
                               (uint)bVar12 * iVar51 |
                               (uint)!bVar12 * *(int *)(local_8d0.ray + 0x1e8);
                          *(uint *)(local_8d0.ray + 0x1ec) =
                               (uint)bVar13 * iVar52 |
                               (uint)!bVar13 * *(int *)(local_8d0.ray + 0x1ec);
                          *(uint *)(local_8d0.ray + 0x1f0) =
                               (uint)bVar14 * iVar53 |
                               (uint)!bVar14 * *(int *)(local_8d0.ray + 0x1f0);
                          *(uint *)(local_8d0.ray + 500) =
                               (uint)bVar15 * iVar54 | (uint)!bVar15 * *(int *)(local_8d0.ray + 500)
                          ;
                          *(uint *)(local_8d0.ray + 0x1f8) =
                               (uint)bVar16 * iVar55 |
                               (uint)!bVar16 * *(int *)(local_8d0.ray + 0x1f8);
                          *(uint *)(local_8d0.ray + 0x1fc) =
                               (uint)bVar17 * iVar56 |
                               (uint)!bVar17 * *(int *)(local_8d0.ray + 0x1fc);
                          iVar50 = *(int *)(local_8d0.hit + 0x84);
                          iVar51 = *(int *)(local_8d0.hit + 0x88);
                          iVar52 = *(int *)(local_8d0.hit + 0x8c);
                          iVar53 = *(int *)(local_8d0.hit + 0x90);
                          iVar54 = *(int *)(local_8d0.hit + 0x94);
                          iVar55 = *(int *)(local_8d0.hit + 0x98);
                          iVar56 = *(int *)(local_8d0.hit + 0x9c);
                          bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
                          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
                          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
                          bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
                          bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
                          bVar16 = (bool)((byte)(uVar70 >> 6) & 1);
                          bVar17 = SUB81(uVar70 >> 7,0);
                          *(uint *)(local_8d0.ray + 0x200) =
                               (uint)(bVar63 & 1) * *(int *)(local_8d0.hit + 0x80) |
                               (uint)!(bool)(bVar63 & 1) * *(int *)(local_8d0.ray + 0x200);
                          *(uint *)(local_8d0.ray + 0x204) =
                               (uint)bVar69 * iVar50 |
                               (uint)!bVar69 * *(int *)(local_8d0.ray + 0x204);
                          *(uint *)(local_8d0.ray + 0x208) =
                               (uint)bVar12 * iVar51 |
                               (uint)!bVar12 * *(int *)(local_8d0.ray + 0x208);
                          *(uint *)(local_8d0.ray + 0x20c) =
                               (uint)bVar13 * iVar52 |
                               (uint)!bVar13 * *(int *)(local_8d0.ray + 0x20c);
                          *(uint *)(local_8d0.ray + 0x210) =
                               (uint)bVar14 * iVar53 |
                               (uint)!bVar14 * *(int *)(local_8d0.ray + 0x210);
                          *(uint *)(local_8d0.ray + 0x214) =
                               (uint)bVar15 * iVar54 |
                               (uint)!bVar15 * *(int *)(local_8d0.ray + 0x214);
                          *(uint *)(local_8d0.ray + 0x218) =
                               (uint)bVar16 * iVar55 |
                               (uint)!bVar16 * *(int *)(local_8d0.ray + 0x218);
                          *(uint *)(local_8d0.ray + 0x21c) =
                               (uint)bVar17 * iVar56 |
                               (uint)!bVar17 * *(int *)(local_8d0.ray + 0x21c);
                          auVar110 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0xa0)
                                                       );
                          *(undefined1 (*) [32])(local_8d0.ray + 0x220) = auVar110;
                          auVar110 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0xc0)
                                                       );
                          *(undefined1 (*) [32])(local_8d0.ray + 0x240) = auVar110;
                          auVar110 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0xe0)
                                                       );
                          *(undefined1 (*) [32])(local_8d0.ray + 0x260) = auVar110;
                          auVar110 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                         (local_8d0.hit + 0x100));
                          *(undefined1 (*) [32])(local_8d0.ray + 0x280) = auVar110;
                          goto LAB_018d6771;
                        }
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar265;
                    }
                  }
                }
              }
            }
LAB_018d6771:
            uVar179 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar249._4_4_ = uVar179;
            auVar249._0_4_ = uVar179;
            auVar249._8_4_ = uVar179;
            auVar249._12_4_ = uVar179;
            auVar249._16_4_ = uVar179;
            auVar249._20_4_ = uVar179;
            auVar249._24_4_ = uVar179;
            auVar249._28_4_ = uVar179;
            auVar251 = ZEXT3264(auVar249);
            auVar57._4_4_ = fStack_53c;
            auVar57._0_4_ = local_540;
            auVar57._8_4_ = fStack_538;
            auVar57._12_4_ = fStack_534;
            auVar57._16_4_ = fStack_530;
            auVar57._20_4_ = fStack_52c;
            auVar57._24_4_ = fStack_528;
            auVar57._28_4_ = fStack_524;
            uVar21 = vcmpps_avx512vl(auVar249,auVar57,0xd);
          }
          auVar169._0_4_ = (float)local_580._0_4_ + (float)local_560._0_4_;
          auVar169._4_4_ = (float)local_580._4_4_ + (float)local_560._4_4_;
          auVar169._8_4_ = fStack_578 + fStack_558;
          auVar169._12_4_ = fStack_574 + fStack_554;
          auVar169._16_4_ = fStack_570 + fStack_550;
          auVar169._20_4_ = fStack_56c + fStack_54c;
          auVar169._24_4_ = fStack_568 + fStack_548;
          auVar169._28_4_ = fStack_564 + fStack_544;
          uVar179 = auVar251._0_4_;
          auVar193._4_4_ = uVar179;
          auVar193._0_4_ = uVar179;
          auVar193._8_4_ = uVar179;
          auVar193._12_4_ = uVar179;
          auVar193._16_4_ = uVar179;
          auVar193._20_4_ = uVar179;
          auVar193._24_4_ = uVar179;
          auVar193._28_4_ = uVar179;
          uVar21 = vcmpps_avx512vl(auVar169,auVar193,2);
          auVar170._8_4_ = 2;
          auVar170._0_8_ = 0x200000002;
          auVar170._12_4_ = 2;
          auVar170._16_4_ = 2;
          auVar170._20_4_ = 2;
          auVar170._24_4_ = 2;
          auVar170._28_4_ = 2;
          auVar35._8_4_ = 3;
          auVar35._0_8_ = 0x300000003;
          auVar35._12_4_ = 3;
          auVar35._16_4_ = 3;
          auVar35._20_4_ = 3;
          auVar35._24_4_ = 3;
          auVar35._28_4_ = 3;
          auVar110 = vpblendmd_avx512vl(auVar170,auVar35);
          local_560._0_4_ = (uint)(bVar61 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar61 & 1) * 2;
          bVar69 = (bool)(bVar61 >> 1 & 1);
          local_560._4_4_ = (uint)bVar69 * auVar110._4_4_ | (uint)!bVar69 * 2;
          bVar69 = (bool)(bVar61 >> 2 & 1);
          fStack_558 = (float)((uint)bVar69 * auVar110._8_4_ | (uint)!bVar69 * 2);
          bVar69 = (bool)(bVar61 >> 3 & 1);
          fStack_554 = (float)((uint)bVar69 * auVar110._12_4_ | (uint)!bVar69 * 2);
          bVar69 = (bool)(bVar61 >> 4 & 1);
          fStack_550 = (float)((uint)bVar69 * auVar110._16_4_ | (uint)!bVar69 * 2);
          bVar69 = (bool)(bVar61 >> 5 & 1);
          fStack_54c = (float)((uint)bVar69 * auVar110._20_4_ | (uint)!bVar69 * 2);
          bVar69 = (bool)(bVar61 >> 6 & 1);
          fStack_548 = (float)((uint)bVar69 * auVar110._24_4_ | (uint)!bVar69 * 2);
          fStack_544 = (float)((uint)(bVar61 >> 7) * auVar110._28_4_ |
                              (uint)!(bool)(bVar61 >> 7) * 2);
          bVar60 = (byte)uVar23 & bVar60 & (byte)uVar21;
          uVar21 = vpcmpd_avx512vl(_local_560,local_4e0,2);
          local_5a0 = _local_340;
          local_540 = (float)local_580._0_4_ + (float)local_340._0_4_;
          fStack_53c = (float)local_580._4_4_ + (float)local_340._4_4_;
          fStack_538 = fStack_578 + fStack_338;
          fStack_534 = fStack_574 + fStack_334;
          fStack_530 = fStack_570 + fStack_330;
          fStack_52c = fStack_56c + fStack_32c;
          fStack_528 = fStack_568 + fStack_328;
          fStack_524 = fStack_564 + fStack_324;
          for (bVar66 = (byte)uVar21 & bVar60; bVar66 != 0;
              bVar66 = ~('\x01' << ((byte)iVar25 & 0x1f)) & bVar66 & (byte)uVar21) {
            auVar171._8_4_ = 0x7f800000;
            auVar171._0_8_ = 0x7f8000007f800000;
            auVar171._12_4_ = 0x7f800000;
            auVar171._16_4_ = 0x7f800000;
            auVar171._20_4_ = 0x7f800000;
            auVar171._24_4_ = 0x7f800000;
            auVar171._28_4_ = 0x7f800000;
            auVar110 = vblendmps_avx512vl(auVar171,local_5a0);
            auVar146._0_4_ =
                 (uint)(bVar66 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar66 & 1) * 0x7f800000;
            bVar69 = (bool)(bVar66 >> 1 & 1);
            auVar146._4_4_ = (uint)bVar69 * auVar110._4_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar66 >> 2 & 1);
            auVar146._8_4_ = (uint)bVar69 * auVar110._8_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar66 >> 3 & 1);
            auVar146._12_4_ = (uint)bVar69 * auVar110._12_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar66 >> 4 & 1);
            auVar146._16_4_ = (uint)bVar69 * auVar110._16_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar66 >> 5 & 1);
            auVar146._20_4_ = (uint)bVar69 * auVar110._20_4_ | (uint)!bVar69 * 0x7f800000;
            auVar146._24_4_ =
                 (uint)(bVar66 >> 6) * auVar110._24_4_ | (uint)!(bool)(bVar66 >> 6) * 0x7f800000;
            auVar146._28_4_ = 0x7f800000;
            auVar110 = vshufps_avx(auVar146,auVar146,0xb1);
            auVar110 = vminps_avx(auVar146,auVar110);
            auVar107 = vshufpd_avx(auVar110,auVar110,5);
            auVar110 = vminps_avx(auVar110,auVar107);
            auVar107 = vpermpd_avx2(auVar110,0x4e);
            auVar110 = vminps_avx(auVar110,auVar107);
            uVar21 = vcmpps_avx512vl(auVar146,auVar110,0);
            bVar63 = (byte)uVar21 & bVar66;
            bVar61 = bVar66;
            if (bVar63 != 0) {
              bVar61 = bVar63;
            }
            iVar25 = 0;
            for (uVar71 = (uint)bVar61; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
              iVar25 = iVar25 + 1;
            }
            uVar71 = *(uint *)(local_320 + (uint)(iVar25 << 2));
            fVar260 = auVar90._0_4_;
            auVar91 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar25 << 2)));
            if ((float)local_800._0_4_ < 0.0) {
              local_860._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar25 << 2)));
              auVar264 = ZEXT1664(auVar264._0_16_);
              auVar274 = ZEXT1664(auVar274._0_16_);
              auVar278 = ZEXT1664(auVar278._0_16_);
              auVar283 = ZEXT1664(auVar283._0_16_);
              fVar260 = sqrtf((float)local_800._0_4_);
              auVar110 = vmovdqa64_avx512vl(auVar97);
              auVar292 = ZEXT3264(auVar110);
              auVar110 = vmovdqa64_avx512vl(auVar96);
              auVar291 = ZEXT3264(auVar110);
              auVar91 = local_860._0_16_;
            }
            auVar259 = ZEXT464(uVar71);
            auVar3 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar85 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar82 = vminps_avx(local_7a0._0_16_,local_7e0._0_16_);
            auVar81 = vminps_avx(auVar3,auVar82);
            auVar3 = vmaxps_avx(local_7a0._0_16_,local_7e0._0_16_);
            auVar82 = vmaxps_avx(auVar85,auVar3);
            auVar226._8_4_ = 0x7fffffff;
            auVar226._0_8_ = 0x7fffffff7fffffff;
            auVar226._12_4_ = 0x7fffffff;
            auVar85 = vandps_avx(auVar81,auVar226);
            auVar3 = vandps_avx(auVar82,auVar226);
            auVar85 = vmaxps_avx(auVar85,auVar3);
            auVar3 = vmovshdup_avx(auVar85);
            auVar3 = vmaxss_avx(auVar3,auVar85);
            auVar85 = vshufpd_avx(auVar85,auVar85,1);
            auVar85 = vmaxss_avx(auVar85,auVar3);
            local_760._0_4_ = auVar85._0_4_ * 1.9073486e-06;
            local_6e0 = vshufps_avx(auVar82,auVar82,0xff);
            auVar91 = vinsertps_avx(ZEXT416(uVar71),auVar91,0x10);
            auVar271 = ZEXT1664(auVar91);
            lVar67 = 5;
            do {
              do {
                bVar69 = lVar67 == 0;
                lVar67 = lVar67 + -1;
                if (bVar69) goto LAB_018d748b;
                uVar179 = auVar271._0_4_;
                auVar161._4_4_ = uVar179;
                auVar161._0_4_ = uVar179;
                auVar161._8_4_ = uVar179;
                auVar161._12_4_ = uVar179;
                auVar91 = vfmadd132ps_fma(auVar161,ZEXT816(0) << 0x40,local_7f0);
                local_740 = auVar271._0_32_;
                auVar85 = vmovshdup_avx(auVar271._0_16_);
                fVar236 = auVar85._0_4_;
                fVar289 = 1.0 - fVar236;
                fVar267 = fVar289 * fVar289 * fVar289;
                fVar265 = fVar236 * fVar236;
                fVar238 = fVar236 * fVar265;
                auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar267),
                                         ZEXT416((uint)fVar238));
                fVar266 = fVar236 * fVar289;
                auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * fVar266 * 6.0)),
                                          ZEXT416((uint)(fVar289 * fVar266)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar82 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar238),
                                          ZEXT416((uint)fVar267));
                auVar78 = vfmadd231ss_fma(ZEXT416((uint)(fVar289 * fVar266 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar236 * fVar266)));
                fVar267 = fVar267 * 0.16666667;
                fVar236 = (auVar3._0_4_ + auVar81._0_4_) * 0.16666667;
                fVar237 = (auVar82._0_4_ + auVar78._0_4_) * 0.16666667;
                fVar238 = fVar238 * 0.16666667;
                auVar206._0_4_ = fVar238 * (float)local_7e0._0_4_;
                auVar206._4_4_ = fVar238 * (float)local_7e0._4_4_;
                auVar206._8_4_ = fVar238 * fStack_7d8;
                auVar206._12_4_ = fVar238 * fStack_7d4;
                auVar241._4_4_ = fVar237;
                auVar241._0_4_ = fVar237;
                auVar241._8_4_ = fVar237;
                auVar241._12_4_ = fVar237;
                auVar3 = vfmadd132ps_fma(auVar241,auVar206,local_7a0._0_16_);
                auVar207._4_4_ = fVar236;
                auVar207._0_4_ = fVar236;
                auVar207._8_4_ = fVar236;
                auVar207._12_4_ = fVar236;
                auVar3 = vfmadd132ps_fma(auVar207,auVar3,local_7c0._0_16_);
                auVar187._4_4_ = fVar267;
                auVar187._0_4_ = fVar267;
                auVar187._8_4_ = fVar267;
                auVar187._12_4_ = fVar267;
                auVar3 = vfmadd132ps_fma(auVar187,auVar3,local_780._0_16_);
                local_600._0_16_ = auVar3;
                auVar3 = vsubps_avx(auVar91,auVar3);
                auVar91 = vdpps_avx(auVar3,auVar3,0x7f);
                local_820._0_16_ = auVar91;
                local_860._0_16_ = ZEXT416((uint)fVar289);
                if (auVar91._0_4_ < 0.0) {
                  local_880._0_4_ = fVar265;
                  local_8a0._0_4_ = fVar266;
                  auVar264._0_4_ = sqrtf(auVar91._0_4_);
                  auVar264._4_60_ = extraout_var_00;
                  auVar91 = auVar264._0_16_;
                  fVar266 = (float)local_8a0._0_4_;
                  auVar82 = local_860._0_16_;
                }
                else {
                  auVar91 = vsqrtss_avx(auVar91,auVar91);
                  local_880._0_4_ = fVar265;
                  auVar82 = ZEXT416((uint)fVar289);
                }
                local_620._4_4_ = auVar82._0_4_;
                local_620._0_4_ = local_620._4_4_;
                fStack_618 = (float)local_620._4_4_;
                fStack_614 = (float)local_620._4_4_;
                auVar81 = vfnmsub213ss_fma(auVar85,auVar85,ZEXT416((uint)(fVar266 * 4.0)));
                auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar266 * 4.0)),auVar82,auVar82);
                fVar265 = (float)local_620._4_4_ * -(float)local_620._4_4_ * 0.5;
                fVar266 = auVar81._0_4_ * 0.5;
                fVar267 = auVar82._0_4_ * 0.5;
                local_880._0_4_ = (float)local_880._0_4_ * 0.5;
                auVar227._0_4_ = (float)local_880._0_4_ * (float)local_7e0._0_4_;
                auVar227._4_4_ = (float)local_880._0_4_ * (float)local_7e0._4_4_;
                auVar227._8_4_ = (float)local_880._0_4_ * fStack_7d8;
                auVar227._12_4_ = (float)local_880._0_4_ * fStack_7d4;
                auVar188._4_4_ = fVar267;
                auVar188._0_4_ = fVar267;
                auVar188._8_4_ = fVar267;
                auVar188._12_4_ = fVar267;
                auVar82 = vfmadd132ps_fma(auVar188,auVar227,local_7a0._0_16_);
                auVar208._4_4_ = fVar266;
                auVar208._0_4_ = fVar266;
                auVar208._8_4_ = fVar266;
                auVar208._12_4_ = fVar266;
                auVar82 = vfmadd132ps_fma(auVar208,auVar82,local_7c0._0_16_);
                auVar281._4_4_ = fVar265;
                auVar281._0_4_ = fVar265;
                auVar281._8_4_ = fVar265;
                auVar281._12_4_ = fVar265;
                _local_880 = vfmadd132ps_fma(auVar281,auVar82,local_780._0_16_);
                local_640._0_16_ = vdpps_avx(_local_880,_local_880,0x7f);
                auVar49._12_4_ = 0;
                auVar49._0_12_ = ZEXT812(0);
                fVar265 = local_640._0_4_;
                auVar81 = vrsqrt14ss_avx512f(auVar49 << 0x20,ZEXT416((uint)fVar265));
                local_660._0_16_ = vrcp14ss_avx512f(auVar49 << 0x20,ZEXT416((uint)fVar265));
                auVar82 = vfnmadd213ss_fma(local_660._0_16_,local_640._0_16_,ZEXT416(0x40000000));
                local_680._0_4_ = auVar82._0_4_;
                local_8a0._0_4_ = auVar91._0_4_;
                if (fVar265 < -fVar265) {
                  local_840 = auVar81;
                  fVar266 = sqrtf(fVar265);
                  auVar91 = ZEXT416((uint)local_8a0._0_4_);
                  auVar82 = local_840;
                  auVar78 = _local_880;
                }
                else {
                  auVar82 = vsqrtss_avx(local_640._0_16_,local_640._0_16_);
                  fVar266 = auVar82._0_4_;
                  auVar82 = auVar81;
                  auVar78 = _local_880;
                }
                fVar267 = auVar82._0_4_;
                auVar83 = vbroadcastss_avx512vl
                                    (ZEXT416((uint)(auVar81._0_4_ * 1.5 +
                                                   fVar265 * -0.5 * fVar267 * fVar267 * fVar267)));
                auVar80 = vmulps_avx512vl(auVar78,auVar83);
                auVar82 = vdpps_avx(auVar3,auVar80,0x7f);
                fVar265 = auVar91._0_4_ + 1.0;
                fVar267 = auVar82._0_4_;
                auVar162._0_4_ = fVar267 * fVar267;
                auVar162._4_4_ = auVar82._4_4_ * auVar82._4_4_;
                auVar162._8_4_ = auVar82._8_4_ * auVar82._8_4_;
                auVar162._12_4_ = auVar82._12_4_ * auVar82._12_4_;
                auVar81 = vsubps_avx(local_820._0_16_,auVar162);
                fVar236 = auVar81._0_4_;
                auVar189._4_12_ = ZEXT812(0) << 0x20;
                auVar189._0_4_ = fVar236;
                auVar79 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar189);
                auVar84 = vmulss_avx512f(auVar79,ZEXT416(0x3fc00000));
                auVar93 = vmulss_avx512f(auVar81,ZEXT416(0xbf000000));
                if (fVar236 < 0.0) {
                  local_840._0_4_ = fVar265;
                  local_6b0._0_4_ = auVar84._0_4_;
                  _local_6d0 = auVar83;
                  local_6c0 = auVar80;
                  local_6a0 = auVar79;
                  fVar236 = sqrtf(fVar236);
                  auVar93 = ZEXT416(auVar93._0_4_);
                  auVar84 = ZEXT416((uint)local_6b0._0_4_);
                  auVar91 = ZEXT416((uint)local_8a0._0_4_);
                  auVar79 = local_6a0;
                  auVar78 = _local_880;
                  fVar265 = (float)local_840._0_4_;
                  auVar80 = local_6c0;
                  auVar83 = _local_6d0;
                }
                else {
                  auVar81 = vsqrtss_avx(auVar81,auVar81);
                  fVar236 = auVar81._0_4_;
                }
                auVar283 = ZEXT1664(auVar78);
                auVar278 = ZEXT1664(local_820._0_16_);
                auVar274 = ZEXT1664(auVar3);
                auVar110 = vmovdqa64_avx512vl(auVar96);
                auVar291 = ZEXT3264(auVar110);
                auVar110 = vmovdqa64_avx512vl(auVar97);
                auVar292 = ZEXT3264(auVar110);
                auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_860._0_16_,auVar85);
                auVar92 = vfmadd213ss_fma(auVar85,SUB6416(ZEXT464(0xc0000000),0),local_860._0_16_);
                auVar270 = local_740._0_16_;
                auVar85 = vshufps_avx(auVar270,auVar270,0x55);
                auVar209._0_4_ = auVar85._0_4_ * (float)local_7e0._0_4_;
                auVar209._4_4_ = auVar85._4_4_ * (float)local_7e0._4_4_;
                auVar209._8_4_ = auVar85._8_4_ * fStack_7d8;
                auVar209._12_4_ = auVar85._12_4_ * fStack_7d4;
                auVar228._0_4_ = auVar92._0_4_;
                auVar228._4_4_ = auVar228._0_4_;
                auVar228._8_4_ = auVar228._0_4_;
                auVar228._12_4_ = auVar228._0_4_;
                auVar85 = vfmadd132ps_fma(auVar228,auVar209,local_7a0._0_16_);
                auVar190._0_4_ = auVar81._0_4_;
                auVar190._4_4_ = auVar190._0_4_;
                auVar190._8_4_ = auVar190._0_4_;
                auVar190._12_4_ = auVar190._0_4_;
                auVar85 = vfmadd132ps_fma(auVar190,auVar85,local_7c0._0_16_);
                auVar85 = vfmadd132ps_fma(_local_620,auVar85,local_780._0_16_);
                auVar191._0_4_ = auVar85._0_4_ * (float)local_640._0_4_;
                auVar191._4_4_ = auVar85._4_4_ * (float)local_640._0_4_;
                auVar191._8_4_ = auVar85._8_4_ * (float)local_640._0_4_;
                auVar191._12_4_ = auVar85._12_4_ * (float)local_640._0_4_;
                auVar85 = vdpps_avx(auVar78,auVar85,0x7f);
                fVar237 = auVar85._0_4_;
                auVar210._0_4_ = auVar78._0_4_ * fVar237;
                auVar210._4_4_ = auVar78._4_4_ * fVar237;
                auVar210._8_4_ = auVar78._8_4_ * fVar237;
                auVar210._12_4_ = auVar78._12_4_ * fVar237;
                auVar85 = vsubps_avx(auVar191,auVar210);
                fVar237 = (float)local_680._0_4_ * (float)local_660._0_4_;
                auVar92 = vmaxss_avx(ZEXT416((uint)local_760._0_4_),
                                     ZEXT416((uint)(local_740._0_4_ * fVar260 * 1.9073486e-06)));
                auVar211._0_4_ = auVar85._0_4_ * fVar237;
                auVar211._4_4_ = auVar85._4_4_ * fVar237;
                auVar211._8_4_ = auVar85._8_4_ * fVar237;
                auVar211._12_4_ = auVar85._12_4_ * fVar237;
                auVar29._8_4_ = 0x80000000;
                auVar29._0_8_ = 0x8000000080000000;
                auVar29._12_4_ = 0x80000000;
                auVar94 = vxorps_avx512vl(auVar78,auVar29);
                auVar83 = vmulps_avx512vl(auVar83,auVar211);
                auVar85 = vdpps_avx(auVar94,auVar80,0x7f);
                auVar81 = vfmadd213ss_fma(auVar91,ZEXT416((uint)local_760._0_4_),auVar92);
                auVar91 = vdpps_avx(auVar3,auVar83,0x7f);
                auVar83 = vfmadd213ss_fma(ZEXT416((uint)fVar265),
                                          ZEXT416((uint)((float)local_760._0_4_ / fVar266)),auVar81)
                ;
                fVar265 = auVar85._0_4_ + auVar91._0_4_;
                auVar91 = vdpps_avx(local_7f0,auVar80,0x7f);
                auVar85 = vdpps_avx(auVar3,auVar94,0x7f);
                auVar81 = vmulss_avx512f(auVar93,auVar79);
                auVar84 = vaddss_avx512f(auVar84,ZEXT416((uint)(auVar81._0_4_ *
                                                               auVar79._0_4_ * auVar79._0_4_)));
                auVar81 = vdpps_avx(auVar3,local_7f0,0x7f);
                auVar80 = vfnmadd231ss_fma(auVar85,auVar82,ZEXT416((uint)fVar265));
                auVar81 = vfnmadd231ss_fma(auVar81,auVar82,auVar91);
                auVar85 = vpermilps_avx(local_600._0_16_,0xff);
                fVar236 = fVar236 - auVar85._0_4_;
                auVar79 = vshufps_avx(auVar78,auVar78,0xff);
                auVar85 = vfmsub213ss_fma(auVar80,auVar84,auVar79);
                auVar262._8_4_ = 0x80000000;
                auVar262._0_8_ = 0x8000000080000000;
                auVar262._12_4_ = 0x80000000;
                auVar264 = ZEXT1664(auVar262);
                auVar257._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
                auVar257._8_4_ = auVar85._8_4_ ^ 0x80000000;
                auVar257._12_4_ = auVar85._12_4_ ^ 0x80000000;
                auVar259 = ZEXT1664(auVar257);
                auVar81 = ZEXT416((uint)(auVar81._0_4_ * auVar84._0_4_));
                auVar80 = vfmsub231ss_fma(ZEXT416((uint)(auVar91._0_4_ * auVar85._0_4_)),
                                          ZEXT416((uint)fVar265),auVar81);
                auVar85 = vinsertps_avx(auVar257,auVar81,0x1c);
                auVar248._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
                auVar248._8_4_ = auVar91._8_4_ ^ 0x80000000;
                auVar248._12_4_ = auVar91._12_4_ ^ 0x80000000;
                auVar81 = vinsertps_avx(ZEXT416((uint)fVar265),auVar248,0x10);
                auVar229._0_4_ = auVar80._0_4_;
                auVar229._4_4_ = auVar229._0_4_;
                auVar229._8_4_ = auVar229._0_4_;
                auVar229._12_4_ = auVar229._0_4_;
                auVar91 = vdivps_avx(auVar85,auVar229);
                auVar85 = vdivps_avx(auVar81,auVar229);
                auVar230._0_4_ = fVar267 * auVar91._0_4_ + fVar236 * auVar85._0_4_;
                auVar230._4_4_ = fVar267 * auVar91._4_4_ + fVar236 * auVar85._4_4_;
                auVar230._8_4_ = fVar267 * auVar91._8_4_ + fVar236 * auVar85._8_4_;
                auVar230._12_4_ = fVar267 * auVar91._12_4_ + fVar236 * auVar85._12_4_;
                auVar91 = vsubps_avx(auVar270,auVar230);
                auVar271 = ZEXT1664(auVar91);
                auVar30._8_4_ = 0x7fffffff;
                auVar30._0_8_ = 0x7fffffff7fffffff;
                auVar30._12_4_ = 0x7fffffff;
                auVar85 = vandps_avx512vl(auVar82,auVar30);
              } while (auVar83._0_4_ <= auVar85._0_4_);
              auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar83._0_4_ + auVar92._0_4_)),local_6e0,
                                        ZEXT416(0x36000000));
              auVar31._8_4_ = 0x7fffffff;
              auVar31._0_8_ = 0x7fffffff7fffffff;
              auVar31._12_4_ = 0x7fffffff;
              auVar82 = vandps_avx512vl(ZEXT416((uint)fVar236),auVar31);
            } while (auVar85._0_4_ <= auVar82._0_4_);
            fVar260 = auVar91._0_4_ + (float)local_6f0._0_4_;
            if (fVar2 <= fVar260) {
              fVar265 = *(float *)(ray + k * 4 + 0x100);
              if (fVar260 <= fVar265) {
                auVar85 = vmovshdup_avx(auVar91);
                fVar266 = auVar85._0_4_;
                if ((0.0 <= fVar266) && (fVar266 <= 1.0)) {
                  auVar85 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_820._0_4_));
                  fVar267 = auVar85._0_4_;
                  pGVar6 = (context->scene->geometries).items[uVar4].ptr;
                  if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    fVar267 = fVar267 * 1.5 + local_820._0_4_ * -0.5 * fVar267 * fVar267 * fVar267;
                    auVar231._0_4_ = auVar3._0_4_ * fVar267;
                    auVar231._4_4_ = auVar3._4_4_ * fVar267;
                    auVar231._8_4_ = auVar3._8_4_ * fVar267;
                    auVar231._12_4_ = auVar3._12_4_ * fVar267;
                    auVar79 = vfmadd213ps_fma(auVar79,auVar231,auVar78);
                    auVar85 = vshufps_avx(auVar231,auVar231,0xc9);
                    auVar82 = vshufps_avx(auVar78,auVar78,0xc9);
                    auVar232._0_4_ = auVar231._0_4_ * auVar82._0_4_;
                    auVar232._4_4_ = auVar231._4_4_ * auVar82._4_4_;
                    auVar232._8_4_ = auVar231._8_4_ * auVar82._8_4_;
                    auVar232._12_4_ = auVar231._12_4_ * auVar82._12_4_;
                    auVar81 = vfmsub231ps_fma(auVar232,auVar78,auVar85);
                    auVar85 = vshufps_avx(auVar81,auVar81,0xc9);
                    auVar82 = vshufps_avx(auVar79,auVar79,0xc9);
                    auVar81 = vshufps_avx(auVar81,auVar81,0xd2);
                    auVar163._0_4_ = auVar79._0_4_ * auVar81._0_4_;
                    auVar163._4_4_ = auVar79._4_4_ * auVar81._4_4_;
                    auVar163._8_4_ = auVar79._8_4_ * auVar81._8_4_;
                    auVar163._12_4_ = auVar79._12_4_ * auVar81._12_4_;
                    auVar85 = vfmsub231ps_fma(auVar163,auVar85,auVar82);
                    uVar179 = auVar85._0_4_;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar260;
                      uVar5 = vextractps_avx(auVar85,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar5;
                      uVar5 = vextractps_avx(auVar85,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar5;
                      *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar179;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar266;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(int *)(ray + k * 4 + 0x220) = (int)local_828;
                      *(uint *)(ray + k * 4 + 0x240) = uVar4;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    }
                    else {
                      pRVar10 = context->user;
                      auVar234._8_4_ = 1;
                      auVar234._0_8_ = 0x100000001;
                      auVar234._12_4_ = 1;
                      auVar234._16_4_ = 1;
                      auVar234._20_4_ = 1;
                      auVar234._24_4_ = 1;
                      auVar234._28_4_ = 1;
                      local_400 = vpermps_avx2(auVar234,ZEXT1632(auVar91));
                      auVar110 = vpermps_avx2(auVar234,ZEXT1632(auVar85));
                      auVar243._8_4_ = 2;
                      auVar243._0_8_ = 0x200000002;
                      auVar243._12_4_ = 2;
                      auVar243._16_4_ = 2;
                      auVar243._20_4_ = 2;
                      auVar243._24_4_ = 2;
                      auVar243._28_4_ = 2;
                      local_440 = vpermps_avx2(auVar243,ZEXT1632(auVar85));
                      local_460[0] = (RTCHitN)auVar110[0];
                      local_460[1] = (RTCHitN)auVar110[1];
                      local_460[2] = (RTCHitN)auVar110[2];
                      local_460[3] = (RTCHitN)auVar110[3];
                      local_460[4] = (RTCHitN)auVar110[4];
                      local_460[5] = (RTCHitN)auVar110[5];
                      local_460[6] = (RTCHitN)auVar110[6];
                      local_460[7] = (RTCHitN)auVar110[7];
                      local_460[8] = (RTCHitN)auVar110[8];
                      local_460[9] = (RTCHitN)auVar110[9];
                      local_460[10] = (RTCHitN)auVar110[10];
                      local_460[0xb] = (RTCHitN)auVar110[0xb];
                      local_460[0xc] = (RTCHitN)auVar110[0xc];
                      local_460[0xd] = (RTCHitN)auVar110[0xd];
                      local_460[0xe] = (RTCHitN)auVar110[0xe];
                      local_460[0xf] = (RTCHitN)auVar110[0xf];
                      local_460[0x10] = (RTCHitN)auVar110[0x10];
                      local_460[0x11] = (RTCHitN)auVar110[0x11];
                      local_460[0x12] = (RTCHitN)auVar110[0x12];
                      local_460[0x13] = (RTCHitN)auVar110[0x13];
                      local_460[0x14] = (RTCHitN)auVar110[0x14];
                      local_460[0x15] = (RTCHitN)auVar110[0x15];
                      local_460[0x16] = (RTCHitN)auVar110[0x16];
                      local_460[0x17] = (RTCHitN)auVar110[0x17];
                      local_460[0x18] = (RTCHitN)auVar110[0x18];
                      local_460[0x19] = (RTCHitN)auVar110[0x19];
                      local_460[0x1a] = (RTCHitN)auVar110[0x1a];
                      local_460[0x1b] = (RTCHitN)auVar110[0x1b];
                      local_460[0x1c] = (RTCHitN)auVar110[0x1c];
                      local_460[0x1d] = (RTCHitN)auVar110[0x1d];
                      local_460[0x1e] = (RTCHitN)auVar110[0x1e];
                      local_460[0x1f] = (RTCHitN)auVar110[0x1f];
                      local_420 = uVar179;
                      uStack_41c = uVar179;
                      uStack_418 = uVar179;
                      uStack_414 = uVar179;
                      uStack_410 = uVar179;
                      uStack_40c = uVar179;
                      uStack_408 = uVar179;
                      uStack_404 = uVar179;
                      local_3e0 = ZEXT432(0) << 0x20;
                      local_3c0 = local_4c0._0_8_;
                      uStack_3b8 = local_4c0._8_8_;
                      uStack_3b0 = local_4c0._16_8_;
                      uStack_3a8 = local_4c0._24_8_;
                      local_3a0 = local_4a0;
                      auVar110 = vpcmpeqd_avx2(local_4a0,local_4a0);
                      local_830[1] = auVar110;
                      *local_830 = auVar110;
                      local_380 = pRVar10->instID[0];
                      uStack_37c = local_380;
                      uStack_378 = local_380;
                      uStack_374 = local_380;
                      uStack_370 = local_380;
                      uStack_36c = local_380;
                      uStack_368 = local_380;
                      uStack_364 = local_380;
                      local_360 = pRVar10->instPrimID[0];
                      uStack_35c = local_360;
                      uStack_358 = local_360;
                      uStack_354 = local_360;
                      uStack_350 = local_360;
                      uStack_34c = local_360;
                      uStack_348 = local_360;
                      uStack_344 = local_360;
                      *(float *)(ray + k * 4 + 0x100) = fVar260;
                      local_720 = local_500;
                      local_8d0.valid = (int *)local_720;
                      local_8d0.geometryUserPtr = pGVar6->userPtr;
                      local_8d0.context = context->user;
                      local_8d0.hit = local_460;
                      local_8d0.N = 8;
                      local_8d0.ray = (RTCRayN *)ray;
                      if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar259 = ZEXT1664(auVar257);
                        auVar264 = ZEXT1664(auVar262);
                        auVar271 = ZEXT1664(auVar91);
                        auVar274 = ZEXT1664(auVar3);
                        auVar278 = ZEXT1664(local_820._0_16_);
                        auVar283 = ZEXT1664(auVar78);
                        (*pGVar6->intersectionFilterN)(&local_8d0);
                        auVar110 = vmovdqa64_avx512vl(auVar97);
                        auVar292 = ZEXT3264(auVar110);
                        auVar110 = vmovdqa64_avx512vl(auVar96);
                        auVar291 = ZEXT3264(auVar110);
                      }
                      if (local_720 != (undefined1  [32])0x0) {
                        p_Var11 = context->args->filter;
                        if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar259 = ZEXT1664(auVar259._0_16_);
                          auVar264 = ZEXT1664(auVar264._0_16_);
                          auVar271 = ZEXT1664(auVar271._0_16_);
                          auVar274 = ZEXT1664(auVar274._0_16_);
                          auVar278 = ZEXT1664(auVar278._0_16_);
                          auVar283 = ZEXT1664(auVar283._0_16_);
                          (*p_Var11)(&local_8d0);
                          auVar110 = vmovdqa64_avx512vl(auVar97);
                          auVar292 = ZEXT3264(auVar110);
                          auVar110 = vmovdqa64_avx512vl(auVar96);
                          auVar291 = ZEXT3264(auVar110);
                        }
                        if (local_720 != (undefined1  [32])0x0) {
                          uVar70 = vptestmd_avx512vl(local_720,local_720);
                          iVar50 = *(int *)(local_8d0.hit + 4);
                          iVar51 = *(int *)(local_8d0.hit + 8);
                          iVar52 = *(int *)(local_8d0.hit + 0xc);
                          iVar53 = *(int *)(local_8d0.hit + 0x10);
                          iVar54 = *(int *)(local_8d0.hit + 0x14);
                          iVar55 = *(int *)(local_8d0.hit + 0x18);
                          iVar56 = *(int *)(local_8d0.hit + 0x1c);
                          bVar61 = (byte)uVar70;
                          bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
                          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
                          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
                          bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
                          bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
                          bVar16 = (bool)((byte)(uVar70 >> 6) & 1);
                          bVar17 = SUB81(uVar70 >> 7,0);
                          *(uint *)(local_8d0.ray + 0x180) =
                               (uint)(bVar61 & 1) * *(int *)local_8d0.hit |
                               (uint)!(bool)(bVar61 & 1) * *(int *)(local_8d0.ray + 0x180);
                          *(uint *)(local_8d0.ray + 0x184) =
                               (uint)bVar69 * iVar50 |
                               (uint)!bVar69 * *(int *)(local_8d0.ray + 0x184);
                          *(uint *)(local_8d0.ray + 0x188) =
                               (uint)bVar12 * iVar51 |
                               (uint)!bVar12 * *(int *)(local_8d0.ray + 0x188);
                          *(uint *)(local_8d0.ray + 0x18c) =
                               (uint)bVar13 * iVar52 |
                               (uint)!bVar13 * *(int *)(local_8d0.ray + 0x18c);
                          *(uint *)(local_8d0.ray + 400) =
                               (uint)bVar14 * iVar53 | (uint)!bVar14 * *(int *)(local_8d0.ray + 400)
                          ;
                          *(uint *)(local_8d0.ray + 0x194) =
                               (uint)bVar15 * iVar54 |
                               (uint)!bVar15 * *(int *)(local_8d0.ray + 0x194);
                          *(uint *)(local_8d0.ray + 0x198) =
                               (uint)bVar16 * iVar55 |
                               (uint)!bVar16 * *(int *)(local_8d0.ray + 0x198);
                          *(uint *)(local_8d0.ray + 0x19c) =
                               (uint)bVar17 * iVar56 |
                               (uint)!bVar17 * *(int *)(local_8d0.ray + 0x19c);
                          iVar50 = *(int *)(local_8d0.hit + 0x24);
                          iVar51 = *(int *)(local_8d0.hit + 0x28);
                          iVar52 = *(int *)(local_8d0.hit + 0x2c);
                          iVar53 = *(int *)(local_8d0.hit + 0x30);
                          iVar54 = *(int *)(local_8d0.hit + 0x34);
                          iVar55 = *(int *)(local_8d0.hit + 0x38);
                          iVar56 = *(int *)(local_8d0.hit + 0x3c);
                          bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
                          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
                          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
                          bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
                          bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
                          bVar16 = (bool)((byte)(uVar70 >> 6) & 1);
                          bVar17 = SUB81(uVar70 >> 7,0);
                          *(uint *)(local_8d0.ray + 0x1a0) =
                               (uint)(bVar61 & 1) * *(int *)(local_8d0.hit + 0x20) |
                               (uint)!(bool)(bVar61 & 1) * *(int *)(local_8d0.ray + 0x1a0);
                          *(uint *)(local_8d0.ray + 0x1a4) =
                               (uint)bVar69 * iVar50 |
                               (uint)!bVar69 * *(int *)(local_8d0.ray + 0x1a4);
                          *(uint *)(local_8d0.ray + 0x1a8) =
                               (uint)bVar12 * iVar51 |
                               (uint)!bVar12 * *(int *)(local_8d0.ray + 0x1a8);
                          *(uint *)(local_8d0.ray + 0x1ac) =
                               (uint)bVar13 * iVar52 |
                               (uint)!bVar13 * *(int *)(local_8d0.ray + 0x1ac);
                          *(uint *)(local_8d0.ray + 0x1b0) =
                               (uint)bVar14 * iVar53 |
                               (uint)!bVar14 * *(int *)(local_8d0.ray + 0x1b0);
                          *(uint *)(local_8d0.ray + 0x1b4) =
                               (uint)bVar15 * iVar54 |
                               (uint)!bVar15 * *(int *)(local_8d0.ray + 0x1b4);
                          *(uint *)(local_8d0.ray + 0x1b8) =
                               (uint)bVar16 * iVar55 |
                               (uint)!bVar16 * *(int *)(local_8d0.ray + 0x1b8);
                          *(uint *)(local_8d0.ray + 0x1bc) =
                               (uint)bVar17 * iVar56 |
                               (uint)!bVar17 * *(int *)(local_8d0.ray + 0x1bc);
                          iVar50 = *(int *)(local_8d0.hit + 0x44);
                          iVar51 = *(int *)(local_8d0.hit + 0x48);
                          iVar52 = *(int *)(local_8d0.hit + 0x4c);
                          iVar53 = *(int *)(local_8d0.hit + 0x50);
                          iVar54 = *(int *)(local_8d0.hit + 0x54);
                          iVar55 = *(int *)(local_8d0.hit + 0x58);
                          iVar56 = *(int *)(local_8d0.hit + 0x5c);
                          bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
                          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
                          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
                          bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
                          bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
                          bVar16 = (bool)((byte)(uVar70 >> 6) & 1);
                          bVar17 = SUB81(uVar70 >> 7,0);
                          *(uint *)(local_8d0.ray + 0x1c0) =
                               (uint)(bVar61 & 1) * *(int *)(local_8d0.hit + 0x40) |
                               (uint)!(bool)(bVar61 & 1) * *(int *)(local_8d0.ray + 0x1c0);
                          *(uint *)(local_8d0.ray + 0x1c4) =
                               (uint)bVar69 * iVar50 |
                               (uint)!bVar69 * *(int *)(local_8d0.ray + 0x1c4);
                          *(uint *)(local_8d0.ray + 0x1c8) =
                               (uint)bVar12 * iVar51 |
                               (uint)!bVar12 * *(int *)(local_8d0.ray + 0x1c8);
                          *(uint *)(local_8d0.ray + 0x1cc) =
                               (uint)bVar13 * iVar52 |
                               (uint)!bVar13 * *(int *)(local_8d0.ray + 0x1cc);
                          *(uint *)(local_8d0.ray + 0x1d0) =
                               (uint)bVar14 * iVar53 |
                               (uint)!bVar14 * *(int *)(local_8d0.ray + 0x1d0);
                          *(uint *)(local_8d0.ray + 0x1d4) =
                               (uint)bVar15 * iVar54 |
                               (uint)!bVar15 * *(int *)(local_8d0.ray + 0x1d4);
                          *(uint *)(local_8d0.ray + 0x1d8) =
                               (uint)bVar16 * iVar55 |
                               (uint)!bVar16 * *(int *)(local_8d0.ray + 0x1d8);
                          *(uint *)(local_8d0.ray + 0x1dc) =
                               (uint)bVar17 * iVar56 |
                               (uint)!bVar17 * *(int *)(local_8d0.ray + 0x1dc);
                          iVar50 = *(int *)(local_8d0.hit + 100);
                          iVar51 = *(int *)(local_8d0.hit + 0x68);
                          iVar52 = *(int *)(local_8d0.hit + 0x6c);
                          iVar53 = *(int *)(local_8d0.hit + 0x70);
                          iVar54 = *(int *)(local_8d0.hit + 0x74);
                          iVar55 = *(int *)(local_8d0.hit + 0x78);
                          iVar56 = *(int *)(local_8d0.hit + 0x7c);
                          bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
                          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
                          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
                          bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
                          bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
                          bVar16 = (bool)((byte)(uVar70 >> 6) & 1);
                          bVar17 = SUB81(uVar70 >> 7,0);
                          *(uint *)(local_8d0.ray + 0x1e0) =
                               (uint)(bVar61 & 1) * *(int *)(local_8d0.hit + 0x60) |
                               (uint)!(bool)(bVar61 & 1) * *(int *)(local_8d0.ray + 0x1e0);
                          *(uint *)(local_8d0.ray + 0x1e4) =
                               (uint)bVar69 * iVar50 |
                               (uint)!bVar69 * *(int *)(local_8d0.ray + 0x1e4);
                          *(uint *)(local_8d0.ray + 0x1e8) =
                               (uint)bVar12 * iVar51 |
                               (uint)!bVar12 * *(int *)(local_8d0.ray + 0x1e8);
                          *(uint *)(local_8d0.ray + 0x1ec) =
                               (uint)bVar13 * iVar52 |
                               (uint)!bVar13 * *(int *)(local_8d0.ray + 0x1ec);
                          *(uint *)(local_8d0.ray + 0x1f0) =
                               (uint)bVar14 * iVar53 |
                               (uint)!bVar14 * *(int *)(local_8d0.ray + 0x1f0);
                          *(uint *)(local_8d0.ray + 500) =
                               (uint)bVar15 * iVar54 | (uint)!bVar15 * *(int *)(local_8d0.ray + 500)
                          ;
                          *(uint *)(local_8d0.ray + 0x1f8) =
                               (uint)bVar16 * iVar55 |
                               (uint)!bVar16 * *(int *)(local_8d0.ray + 0x1f8);
                          *(uint *)(local_8d0.ray + 0x1fc) =
                               (uint)bVar17 * iVar56 |
                               (uint)!bVar17 * *(int *)(local_8d0.ray + 0x1fc);
                          iVar50 = *(int *)(local_8d0.hit + 0x84);
                          iVar51 = *(int *)(local_8d0.hit + 0x88);
                          iVar52 = *(int *)(local_8d0.hit + 0x8c);
                          iVar53 = *(int *)(local_8d0.hit + 0x90);
                          iVar54 = *(int *)(local_8d0.hit + 0x94);
                          iVar55 = *(int *)(local_8d0.hit + 0x98);
                          iVar56 = *(int *)(local_8d0.hit + 0x9c);
                          bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
                          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
                          bVar13 = (bool)((byte)(uVar70 >> 3) & 1);
                          bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
                          bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
                          bVar16 = (bool)((byte)(uVar70 >> 6) & 1);
                          bVar17 = SUB81(uVar70 >> 7,0);
                          *(uint *)(local_8d0.ray + 0x200) =
                               (uint)(bVar61 & 1) * *(int *)(local_8d0.hit + 0x80) |
                               (uint)!(bool)(bVar61 & 1) * *(int *)(local_8d0.ray + 0x200);
                          *(uint *)(local_8d0.ray + 0x204) =
                               (uint)bVar69 * iVar50 |
                               (uint)!bVar69 * *(int *)(local_8d0.ray + 0x204);
                          *(uint *)(local_8d0.ray + 0x208) =
                               (uint)bVar12 * iVar51 |
                               (uint)!bVar12 * *(int *)(local_8d0.ray + 0x208);
                          *(uint *)(local_8d0.ray + 0x20c) =
                               (uint)bVar13 * iVar52 |
                               (uint)!bVar13 * *(int *)(local_8d0.ray + 0x20c);
                          *(uint *)(local_8d0.ray + 0x210) =
                               (uint)bVar14 * iVar53 |
                               (uint)!bVar14 * *(int *)(local_8d0.ray + 0x210);
                          *(uint *)(local_8d0.ray + 0x214) =
                               (uint)bVar15 * iVar54 |
                               (uint)!bVar15 * *(int *)(local_8d0.ray + 0x214);
                          *(uint *)(local_8d0.ray + 0x218) =
                               (uint)bVar16 * iVar55 |
                               (uint)!bVar16 * *(int *)(local_8d0.ray + 0x218);
                          *(uint *)(local_8d0.ray + 0x21c) =
                               (uint)bVar17 * iVar56 |
                               (uint)!bVar17 * *(int *)(local_8d0.ray + 0x21c);
                          auVar110 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0xa0)
                                                       );
                          *(undefined1 (*) [32])(local_8d0.ray + 0x220) = auVar110;
                          auVar110 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0xc0)
                                                       );
                          *(undefined1 (*) [32])(local_8d0.ray + 0x240) = auVar110;
                          auVar110 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0xe0)
                                                       );
                          *(undefined1 (*) [32])(local_8d0.ray + 0x260) = auVar110;
                          auVar110 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                         (local_8d0.hit + 0x100));
                          *(undefined1 (*) [32])(local_8d0.ray + 0x280) = auVar110;
                          goto LAB_018d748b;
                        }
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar265;
                    }
                  }
                }
              }
            }
LAB_018d748b:
            uVar179 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar250._4_4_ = uVar179;
            auVar250._0_4_ = uVar179;
            auVar250._8_4_ = uVar179;
            auVar250._12_4_ = uVar179;
            auVar250._16_4_ = uVar179;
            auVar250._20_4_ = uVar179;
            auVar250._24_4_ = uVar179;
            auVar250._28_4_ = uVar179;
            auVar251 = ZEXT3264(auVar250);
            auVar58._4_4_ = fStack_53c;
            auVar58._0_4_ = local_540;
            auVar58._8_4_ = fStack_538;
            auVar58._12_4_ = fStack_534;
            auVar58._16_4_ = fStack_530;
            auVar58._20_4_ = fStack_52c;
            auVar58._24_4_ = fStack_528;
            auVar58._28_4_ = fStack_524;
            uVar21 = vcmpps_avx512vl(auVar250,auVar58,0xd);
          }
          uVar24 = vpcmpd_avx512vl(local_4e0,local_300,1);
          uVar23 = vpcmpd_avx512vl(local_4e0,_local_560,1);
          auVar194._0_4_ = (float)local_580._0_4_ + (float)local_200._0_4_;
          auVar194._4_4_ = (float)local_580._4_4_ + (float)local_200._4_4_;
          auVar194._8_4_ = fStack_578 + fStack_1f8;
          auVar194._12_4_ = fStack_574 + fStack_1f4;
          auVar194._16_4_ = fStack_570 + fStack_1f0;
          auVar194._20_4_ = fStack_56c + fStack_1ec;
          auVar194._24_4_ = fStack_568 + fStack_1e8;
          auVar194._28_4_ = fStack_564 + fStack_1e4;
          uVar179 = auVar251._0_4_;
          auVar212._4_4_ = uVar179;
          auVar212._0_4_ = uVar179;
          auVar212._8_4_ = uVar179;
          auVar212._12_4_ = uVar179;
          auVar212._16_4_ = uVar179;
          auVar212._20_4_ = uVar179;
          auVar212._24_4_ = uVar179;
          auVar212._28_4_ = uVar179;
          uVar21 = vcmpps_avx512vl(auVar194,auVar212,2);
          bVar65 = bVar65 & (byte)uVar24 & (byte)uVar21;
          auVar235._0_4_ = (float)local_580._0_4_ + (float)local_340._0_4_;
          auVar235._4_4_ = (float)local_580._4_4_ + (float)local_340._4_4_;
          auVar235._8_4_ = fStack_578 + fStack_338;
          auVar235._12_4_ = fStack_574 + fStack_334;
          auVar235._16_4_ = fStack_570 + fStack_330;
          auVar235._20_4_ = fStack_56c + fStack_32c;
          auVar235._24_4_ = fStack_568 + fStack_328;
          auVar235._28_4_ = fStack_564 + fStack_324;
          uVar21 = vcmpps_avx512vl(auVar235,auVar212,2);
          bVar60 = bVar60 & (byte)uVar23 & (byte)uVar21 | bVar65;
          if (bVar60 != 0) {
            abStack_180[uVar64 * 0x60] = bVar60;
            bVar69 = (bool)(bVar65 >> 1 & 1);
            bVar12 = (bool)(bVar65 >> 2 & 1);
            bVar13 = (bool)(bVar65 >> 3 & 1);
            bVar14 = (bool)(bVar65 >> 4 & 1);
            bVar15 = (bool)(bVar65 >> 5 & 1);
            auStack_160[uVar64 * 0x18] =
                 (uint)(bVar65 & 1) * local_200._0_4_ | (uint)!(bool)(bVar65 & 1) * local_340._0_4_;
            auStack_160[uVar64 * 0x18 + 1] =
                 (uint)bVar69 * local_200._4_4_ | (uint)!bVar69 * local_340._4_4_;
            auStack_160[uVar64 * 0x18 + 2] =
                 (uint)bVar12 * (int)fStack_1f8 | (uint)!bVar12 * (int)fStack_338;
            auStack_160[uVar64 * 0x18 + 3] =
                 (uint)bVar13 * (int)fStack_1f4 | (uint)!bVar13 * (int)fStack_334;
            auStack_160[uVar64 * 0x18 + 4] =
                 (uint)bVar14 * (int)fStack_1f0 | (uint)!bVar14 * (int)fStack_330;
            auStack_160[uVar64 * 0x18 + 5] =
                 (uint)bVar15 * (int)fStack_1ec | (uint)!bVar15 * (int)fStack_32c;
            auStack_160[uVar64 * 0x18 + 6] =
                 (uint)(bVar65 >> 6) * (int)fStack_1e8 |
                 (uint)!(bool)(bVar65 >> 6) * (int)fStack_328;
            (&fStack_144)[uVar64 * 0x18] = fStack_324;
            uVar70 = vmovlps_avx(local_510);
            (&uStack_140)[uVar64 * 0xc] = uVar70;
            aiStack_138[uVar64 * 0x18] = local_b10 + 1;
            uVar64 = (ulong)((int)uVar64 + 1);
          }
        }
        auVar251 = ZEXT3264(_DAT_01f7b040);
      }
    }
    do {
      uVar71 = (uint)uVar64;
      uVar64 = (ulong)(uVar71 - 1);
      if (uVar71 == 0) {
        uVar179 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar32._4_4_ = uVar179;
        auVar32._0_4_ = uVar179;
        auVar32._8_4_ = uVar179;
        auVar32._12_4_ = uVar179;
        uVar21 = vcmpps_avx512vl(local_520,auVar32,2);
        local_688 = (ulong)((uint)uVar21 & (uint)local_688 - 1 & (uint)local_688);
        goto LAB_018d4ded;
      }
      auVar110 = *(undefined1 (*) [32])(auStack_160 + uVar64 * 0x18);
      auVar195._0_4_ = auVar110._0_4_ + (float)local_580._0_4_;
      auVar195._4_4_ = auVar110._4_4_ + (float)local_580._4_4_;
      auVar195._8_4_ = auVar110._8_4_ + fStack_578;
      auVar195._12_4_ = auVar110._12_4_ + fStack_574;
      auVar195._16_4_ = auVar110._16_4_ + fStack_570;
      auVar195._20_4_ = auVar110._20_4_ + fStack_56c;
      auVar195._24_4_ = auVar110._24_4_ + fStack_568;
      auVar195._28_4_ = auVar110._28_4_ + fStack_564;
      uVar179 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar36._4_4_ = uVar179;
      auVar36._0_4_ = uVar179;
      auVar36._8_4_ = uVar179;
      auVar36._12_4_ = uVar179;
      auVar36._16_4_ = uVar179;
      auVar36._20_4_ = uVar179;
      auVar36._24_4_ = uVar179;
      auVar36._28_4_ = uVar179;
      uVar21 = vcmpps_avx512vl(auVar195,auVar36,2);
      uVar148 = (uint)uVar21 & (uint)abStack_180[uVar64 * 0x60];
    } while (uVar148 == 0);
    uVar70 = (&uStack_140)[uVar64 * 0xc];
    auVar192._8_8_ = 0;
    auVar192._0_8_ = uVar70;
    auVar213._8_4_ = 0x7f800000;
    auVar213._0_8_ = 0x7f8000007f800000;
    auVar213._12_4_ = 0x7f800000;
    auVar213._16_4_ = 0x7f800000;
    auVar213._20_4_ = 0x7f800000;
    auVar213._24_4_ = 0x7f800000;
    auVar213._28_4_ = 0x7f800000;
    auVar107 = vblendmps_avx512vl(auVar213,auVar110);
    bVar60 = (byte)uVar148;
    auVar147._0_4_ =
         (uint)(bVar60 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar60 & 1) * (int)auVar110._0_4_;
    bVar69 = (bool)((byte)(uVar148 >> 1) & 1);
    auVar147._4_4_ = (uint)bVar69 * auVar107._4_4_ | (uint)!bVar69 * (int)auVar110._4_4_;
    bVar69 = (bool)((byte)(uVar148 >> 2) & 1);
    auVar147._8_4_ = (uint)bVar69 * auVar107._8_4_ | (uint)!bVar69 * (int)auVar110._8_4_;
    bVar69 = (bool)((byte)(uVar148 >> 3) & 1);
    auVar147._12_4_ = (uint)bVar69 * auVar107._12_4_ | (uint)!bVar69 * (int)auVar110._12_4_;
    bVar69 = (bool)((byte)(uVar148 >> 4) & 1);
    auVar147._16_4_ = (uint)bVar69 * auVar107._16_4_ | (uint)!bVar69 * (int)auVar110._16_4_;
    bVar69 = (bool)((byte)(uVar148 >> 5) & 1);
    auVar147._20_4_ = (uint)bVar69 * auVar107._20_4_ | (uint)!bVar69 * (int)auVar110._20_4_;
    bVar69 = (bool)((byte)(uVar148 >> 6) & 1);
    auVar147._24_4_ = (uint)bVar69 * auVar107._24_4_ | (uint)!bVar69 * (int)auVar110._24_4_;
    auVar147._28_4_ =
         (uVar148 >> 7) * auVar107._28_4_ | (uint)!SUB41(uVar148 >> 7,0) * (int)auVar110._28_4_;
    auVar110 = vshufps_avx(auVar147,auVar147,0xb1);
    auVar110 = vminps_avx(auVar147,auVar110);
    auVar107 = vshufpd_avx(auVar110,auVar110,5);
    auVar110 = vminps_avx(auVar110,auVar107);
    auVar107 = vpermpd_avx2(auVar110,0x4e);
    auVar110 = vminps_avx(auVar110,auVar107);
    uVar21 = vcmpps_avx512vl(auVar147,auVar110,0);
    bVar66 = (byte)uVar21 & bVar60;
    if (bVar66 != 0) {
      uVar148 = (uint)bVar66;
    }
    uVar149 = 0;
    for (; (uVar148 & 1) == 0; uVar148 = uVar148 >> 1 | 0x80000000) {
      uVar149 = uVar149 + 1;
    }
    local_b10 = aiStack_138[uVar64 * 0x18];
    bVar60 = ~('\x01' << ((byte)uVar149 & 0x1f)) & bVar60;
    abStack_180[uVar64 * 0x60] = bVar60;
    if (bVar60 == 0) {
      uVar71 = uVar71 - 1;
    }
    uVar179 = (undefined4)uVar70;
    auVar172._4_4_ = uVar179;
    auVar172._0_4_ = uVar179;
    auVar172._8_4_ = uVar179;
    auVar172._12_4_ = uVar179;
    auVar172._16_4_ = uVar179;
    auVar172._20_4_ = uVar179;
    auVar172._24_4_ = uVar179;
    auVar172._28_4_ = uVar179;
    auVar91 = vmovshdup_avx(auVar192);
    auVar91 = vsubps_avx(auVar91,auVar192);
    auVar196._0_4_ = auVar91._0_4_;
    auVar196._4_4_ = auVar196._0_4_;
    auVar196._8_4_ = auVar196._0_4_;
    auVar196._12_4_ = auVar196._0_4_;
    auVar196._16_4_ = auVar196._0_4_;
    auVar196._20_4_ = auVar196._0_4_;
    auVar196._24_4_ = auVar196._0_4_;
    auVar196._28_4_ = auVar196._0_4_;
    auVar91 = vfmadd132ps_fma(auVar196,auVar172,auVar251._0_32_);
    auVar110 = ZEXT1632(auVar91);
    local_460[0] = (RTCHitN)auVar110[0];
    local_460[1] = (RTCHitN)auVar110[1];
    local_460[2] = (RTCHitN)auVar110[2];
    local_460[3] = (RTCHitN)auVar110[3];
    local_460[4] = (RTCHitN)auVar110[4];
    local_460[5] = (RTCHitN)auVar110[5];
    local_460[6] = (RTCHitN)auVar110[6];
    local_460[7] = (RTCHitN)auVar110[7];
    local_460[8] = (RTCHitN)auVar110[8];
    local_460[9] = (RTCHitN)auVar110[9];
    local_460[10] = (RTCHitN)auVar110[10];
    local_460[0xb] = (RTCHitN)auVar110[0xb];
    local_460[0xc] = (RTCHitN)auVar110[0xc];
    local_460[0xd] = (RTCHitN)auVar110[0xd];
    local_460[0xe] = (RTCHitN)auVar110[0xe];
    local_460[0xf] = (RTCHitN)auVar110[0xf];
    local_460[0x10] = (RTCHitN)auVar110[0x10];
    local_460[0x11] = (RTCHitN)auVar110[0x11];
    local_460[0x12] = (RTCHitN)auVar110[0x12];
    local_460[0x13] = (RTCHitN)auVar110[0x13];
    local_460[0x14] = (RTCHitN)auVar110[0x14];
    local_460[0x15] = (RTCHitN)auVar110[0x15];
    local_460[0x16] = (RTCHitN)auVar110[0x16];
    local_460[0x17] = (RTCHitN)auVar110[0x17];
    local_460[0x18] = (RTCHitN)auVar110[0x18];
    local_460[0x19] = (RTCHitN)auVar110[0x19];
    local_460[0x1a] = (RTCHitN)auVar110[0x1a];
    local_460[0x1b] = (RTCHitN)auVar110[0x1b];
    local_460[0x1c] = (RTCHitN)auVar110[0x1c];
    local_460[0x1d] = (RTCHitN)auVar110[0x1d];
    local_460[0x1e] = (RTCHitN)auVar110[0x1e];
    local_460[0x1f] = (RTCHitN)auVar110[0x1f];
    local_510._8_8_ = 0;
    local_510._0_8_ = *(ulong *)(local_460 + (ulong)uVar149 * 4);
    uVar64 = (ulong)uVar71;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }